

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

int ncnn::conv3x3s1_winograd63(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [32];
  undefined4 uVar6;
  size_t sVar7;
  float fVar8;
  float fVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 (*pauVar23) [64];
  undefined1 (*pauVar24) [32];
  undefined1 (*pauVar25) [16];
  void *pvVar26;
  undefined4 *puVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  undefined8 *puVar37;
  undefined8 *puVar38;
  float *pfVar39;
  float *pfVar40;
  int iVar41;
  uint uVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  uint uVar46;
  int iVar47;
  undefined1 (*pauVar48) [64];
  uint uVar49;
  uint uVar50;
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar87 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat m;
  Mat m_1;
  float tmp [6] [8] [16];
  Allocator *_allocator;
  int local_f38;
  uint local_f34;
  ulong local_f30;
  void *local_f28;
  long local_f20;
  void *local_f18;
  ulong local_f10;
  ulong local_f08;
  void *local_f00;
  _func_int ***local_ef8;
  ulong local_ef0;
  long local_ee8;
  int local_edc;
  int local_ed8;
  uint local_ed4;
  Mat local_ed0;
  Mat *local_e88;
  ulong local_e80;
  void *local_e78;
  long local_e70;
  long local_e68;
  long local_e60;
  long local_e58;
  void *local_e50;
  long local_e48;
  long local_e40;
  ulong local_e38;
  long local_e30;
  int local_e24;
  ulong local_e20;
  ulong local_e18;
  ulong local_e10;
  long local_e08;
  Mat local_e00;
  Mat local_db0;
  ulong local_d68;
  void *local_d60;
  long local_d58;
  void *local_d50;
  long local_d48;
  int local_d3c;
  long local_d38;
  long local_d30;
  ulong local_d28;
  Mat local_d20;
  ulong local_cd0;
  Mat *local_cc8;
  void *local_cc0;
  long local_cb8;
  long local_cb0;
  long local_ca8;
  long local_ca0;
  long local_c98;
  ulong local_c90;
  Mat *local_c88;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float afStack_c6c [3];
  Allocator *pAStack_c60;
  int iStack_c58;
  int iStack_c54;
  int iStack_c50;
  float fStack_c4c;
  int iStack_c48;
  float fStack_c44;
  size_t local_c40 [4];
  float afStack_c20 [8];
  undefined8 local_c00 [4];
  float afStack_be0 [8];
  float local_bc0 [8];
  float afStack_ba0 [8];
  undefined8 local_b80 [8];
  undefined8 local_b40 [8];
  undefined8 local_b00 [8];
  undefined1 local_ac0 [64];
  undefined1 auStack_a80 [128];
  undefined1 auStack_a00 [128];
  undefined1 auStack_980 [256];
  undefined1 auStack_880 [256];
  undefined1 auStack_780 [256];
  undefined1 auStack_680 [512];
  undefined1 auStack_480 [512];
  undefined1 auStack_280 [512];
  undefined1 auStack_80 [80];
  
  uVar49 = top_blob->elempack * top_blob->c;
  uVar50 = ((top_blob->h + 5) / 6) * ((top_blob->w + 5) / 6);
  uVar46 = bottom_blob->elempack * bottom_blob->c;
  local_e88 = top_blob;
  local_cc8 = bias;
  local_c88 = AT;
  get_optimal_tile_mnk(uVar49,uVar50,uVar46,(int *)&local_ed4,(int *)&local_f34,&local_f38,nT);
  local_e24 = (int)(uVar49 + local_ed4 + -1) / (int)local_ed4;
  iVar47 = (int)(uVar50 + local_f34 + -1) / (int)local_f34;
  iVar11 = (int)(local_f38 + uVar46 + -1) / local_f38;
  iVar33 = local_f38 * local_f34;
  _allocator = opt->workspace_allocator;
  local_db0.cstep = 0;
  local_db0.data = (void *)0x0;
  local_db0.refcount._0_4_ = 0;
  local_db0.refcount._4_4_ = 0;
  local_db0.elemsize._0_4_ = 0;
  local_db0.elemsize._4_4_ = 0;
  local_db0.elempack = 0;
  local_db0.allocator = (Allocator *)0x0;
  local_db0.dims = 0;
  local_db0.w = 0;
  local_db0.h = 0;
  local_db0.d = 0;
  local_db0.c = 0;
  local_e20 = (ulong)uVar50;
  local_e10 = (ulong)uVar46;
  local_cd0 = (ulong)uVar49;
  Mat::create(&local_db0,iVar33,0x40,iVar11,iVar47,4,_allocator);
  iVar28 = -100;
  if ((local_db0.data == (void *)0x0) || ((long)local_db0.c * local_db0.cstep == 0))
  goto LAB_001b3436;
  iVar47 = iVar47 * iVar11;
  iVar33 = iVar33 * 0x40;
  if ((nT < 2) || (nT <= iVar47)) {
    local_c40[0] = 0;
    local_c80 = (undefined1  [8])0x0;
    fStack_c78 = 0.0;
    fStack_c74 = 0.0;
    fStack_c70 = 0.0;
    afStack_c6c[0] = 0.0;
    afStack_c6c[1] = 0.0;
    pAStack_c60 = (Allocator *)0x0;
    iStack_c58 = 0;
    iStack_c54 = 0;
    iStack_c50 = 0;
    fStack_c4c = 0.0;
    iStack_c48 = 0;
    Mat::create((Mat *)local_c80,iVar33,1,nT,4,opt->workspace_allocator);
    bVar51 = local_c80 == (undefined1  [8])0x0;
    bVar52 = (long)iStack_c48 * local_c40[0] == 0;
    if (!bVar51 && !bVar52) {
      if (0 < iVar47) {
        iVar33 = 0;
        do {
          iVar41 = local_f34 * (iVar33 / iVar11);
          iVar28 = local_f38 * (iVar33 % iVar11);
          uVar46 = (int)local_e20 - iVar41;
          if ((int)local_f34 < (int)uVar46) {
            uVar46 = local_f34;
          }
          iVar34 = (int)local_e10 - iVar28;
          if (local_f38 < iVar34) {
            iVar34 = local_f38;
          }
          iVar12 = get_omp_thread_num();
          uVar32 = CONCAT44(afStack_c6c[0],fStack_c70);
          local_ed0.data = (void *)((long)iVar12 * local_c40[0] * uVar32 + (long)local_c80);
          local_ed0.refcount._0_4_ = 0;
          local_ed0.refcount._4_4_ = 0;
          local_ed0.elemsize._0_4_ = (int)fStack_c70;
          local_ed0.elemsize._4_4_ = (int)afStack_c6c[0];
          local_ed0.elempack = (int)afStack_c6c[1];
          local_ed0.allocator = pAStack_c60;
          local_ed0.w = iStack_c54;
          local_ed0.h = iStack_c50;
          local_ed0.d = 1;
          local_ed0.c = (int)fStack_c4c;
          local_ed0.dims = iStack_c58 + -1;
          local_ed0.cstep =
               (uVar32 * (long)iStack_c50 * (long)iStack_c54 + 0xf & 0xfffffffffffffff0) / uVar32;
          if (iStack_c58 == 4) {
            local_ed0.cstep = (long)iStack_c50 * (long)iStack_c54;
          }
          conv3x3s1_winograd63_transform_input_tile
                    (bottom_blob,&local_ed0,iVar41,uVar46,iVar28,iVar34,(int)_allocator);
          local_e00.cstep = (long)local_db0.h * (long)local_db0.w;
          local_e00.data =
               (void *)((long)local_db0.data +
                       (ulong)(uint)(iVar33 % iVar11) *
                       CONCAT44(local_db0.elemsize._4_4_,(undefined4)local_db0.elemsize) *
                       local_e00.cstep +
                       (long)(iVar33 / iVar11) * local_db0.cstep *
                       CONCAT44(local_db0.elemsize._4_4_,(undefined4)local_db0.elemsize));
          local_e00.refcount._0_4_ = 0;
          local_e00.refcount._4_4_ = 0;
          local_e00.elemsize._0_4_ = (undefined4)local_db0.elemsize;
          local_e00.elemsize._4_4_ = local_db0.elemsize._4_4_;
          local_e00.elempack = local_db0.elempack;
          local_e00.allocator = local_db0.allocator;
          local_e00.dims = 2;
          local_e00.w = local_db0.w;
          local_e00.h = local_db0.h;
          local_e00.d = 1;
          local_e00.c = 1;
          transpose_pack_B_tile(&local_ed0,&local_e00,0x40,uVar46,iVar34,(int)local_e00.cstep);
          piVar10 = (int *)CONCAT44(local_e00.refcount._4_4_,(int)local_e00.refcount);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_e00.allocator == (Allocator *)0x0) {
                if (local_e00.data != (void *)0x0) {
                  free(local_e00.data);
                }
              }
              else {
                (*(local_e00.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_e00.cstep = 0;
          local_e00.data = (void *)0x0;
          local_e00.refcount._0_4_ = 0;
          local_e00.refcount._4_4_ = 0;
          local_e00.elemsize._0_4_ = 0;
          local_e00.elemsize._4_4_ = 0;
          local_e00.elempack = 0;
          local_e00.dims = 0;
          local_e00.w = 0;
          local_e00.h = 0;
          local_e00.d = 0;
          local_e00.c = 0;
          piVar10 = (int *)CONCAT44(local_ed0.refcount._4_4_,(int)local_ed0.refcount);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_ed0.allocator == (Allocator *)0x0) {
                if (local_ed0.data != (void *)0x0) {
                  free(local_ed0.data);
                }
              }
              else {
                (*(local_ed0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_ed0.cstep = 0;
          local_ed0.data = (void *)0x0;
          local_ed0.refcount._0_4_ = 0;
          local_ed0.refcount._4_4_ = 0;
          local_ed0.elemsize._0_4_ = 0;
          local_ed0.elemsize._4_4_ = 0;
          local_ed0.elempack = 0;
          local_ed0.dims = 0;
          local_ed0.w = 0;
          local_ed0.h = 0;
          local_ed0.d = 0;
          local_ed0.c = 0;
          iVar33 = iVar33 + 1;
        } while (iVar47 != iVar33);
      }
      piVar10 = (int *)CONCAT44(fStack_c74,fStack_c78);
      iVar28 = -100;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (pAStack_c60 == (Allocator *)0x0) {
            if (local_c80 != (undefined1  [8])0x0) {
              free((void *)local_c80);
            }
          }
          else {
            (*pAStack_c60->_vptr_Allocator[3])();
          }
        }
      }
      local_c40[0] = 0;
      local_c80 = (undefined1  [8])0x0;
      fStack_c78 = 0.0;
      fStack_c74 = 0.0;
      fStack_c70 = 0.0;
      afStack_c6c[1] = 0.0;
      iStack_c48 = 0;
      afStack_c6c[0] = fStack_c78;
      iStack_c58 = (int)fStack_c74;
      iStack_c54 = (int)fStack_c70;
      iStack_c50 = (int)fStack_c78;
      fStack_c4c = afStack_c6c[1];
      if (bVar51 || bVar52) goto LAB_001b3436;
      goto LAB_001b0563;
    }
    piVar10 = (int *)CONCAT44(fStack_c74,fStack_c78);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (pAStack_c60 == (Allocator *)0x0) goto LAB_001b0489;
        (*pAStack_c60->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_c40[0] = 0;
    local_c80 = (undefined1  [8])0x0;
    fStack_c78 = 0.0;
    fStack_c74 = 0.0;
    fStack_c70 = 0.0;
    afStack_c6c[0] = 0.0;
    afStack_c6c[1] = 0.0;
    pAStack_c60 = (Allocator *)0x0;
    iStack_c58 = 0;
    iStack_c54 = 0;
    iStack_c50 = 0;
    fStack_c4c = 0.0;
    iStack_c48 = 0;
    Mat::create((Mat *)local_c80,iVar33,4,opt->workspace_allocator);
    bVar51 = local_c80 == (undefined1  [8])0x0;
    bVar52 = (long)iStack_c48 * local_c40[0] == 0;
    if (!bVar51 && !bVar52) {
      if (0 < iVar47) {
        iVar33 = 0;
        do {
          iVar28 = local_f34 * (iVar33 / iVar11);
          iVar41 = local_f38 * (iVar33 % iVar11);
          uVar46 = (int)local_e20 - iVar28;
          if ((int)local_f34 < (int)uVar46) {
            uVar46 = local_f34;
          }
          iVar34 = (int)local_e10 - iVar41;
          if (local_f38 < iVar34) {
            iVar34 = local_f38;
          }
          conv3x3s1_winograd63_transform_input_tile
                    (bottom_blob,(Mat *)local_c80,iVar28,uVar46,iVar41,iVar34,(int)_allocator);
          local_ed0.cstep = (long)local_db0.h * (long)local_db0.w;
          local_ed0.data =
               (void *)((long)local_db0.data +
                       (ulong)(uint)(iVar33 % iVar11) *
                       CONCAT44(local_db0.elemsize._4_4_,(undefined4)local_db0.elemsize) *
                       local_ed0.cstep +
                       (long)(iVar33 / iVar11) * local_db0.cstep *
                       CONCAT44(local_db0.elemsize._4_4_,(undefined4)local_db0.elemsize));
          local_ed0.refcount._0_4_ = 0;
          local_ed0.refcount._4_4_ = 0;
          local_ed0.elemsize._0_4_ = (undefined4)local_db0.elemsize;
          local_ed0.elemsize._4_4_ = local_db0.elemsize._4_4_;
          local_ed0.elempack = local_db0.elempack;
          local_ed0.allocator = local_db0.allocator;
          local_ed0.dims = 2;
          local_ed0.w = local_db0.w;
          local_ed0.h = local_db0.h;
          local_ed0.d = 1;
          local_ed0.c = 1;
          transpose_pack_B_tile((Mat *)local_c80,&local_ed0,0x40,uVar46,iVar34,(int)local_ed0.cstep)
          ;
          piVar10 = (int *)CONCAT44(local_ed0.refcount._4_4_,(int)local_ed0.refcount);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_ed0.allocator == (Allocator *)0x0) {
                if (local_ed0.data != (void *)0x0) {
                  free(local_ed0.data);
                }
              }
              else {
                (*(local_ed0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_ed0.cstep = 0;
          local_ed0.data = (void *)0x0;
          local_ed0.refcount._0_4_ = 0;
          local_ed0.refcount._4_4_ = 0;
          local_ed0.elemsize._0_4_ = 0;
          local_ed0.elemsize._4_4_ = 0;
          local_ed0.elempack = 0;
          local_ed0.dims = 0;
          local_ed0.w = 0;
          local_ed0.h = 0;
          local_ed0.d = 0;
          local_ed0.c = 0;
          iVar33 = iVar33 + 1;
        } while (iVar47 != iVar33);
      }
      piVar10 = (int *)CONCAT44(fStack_c74,fStack_c78);
      iVar28 = -100;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (pAStack_c60 == (Allocator *)0x0) {
            if (local_c80 != (undefined1  [8])0x0) {
              free((void *)local_c80);
            }
          }
          else {
            (*pAStack_c60->_vptr_Allocator[3])();
          }
        }
      }
      local_c40[0] = 0;
      local_c80 = (undefined1  [8])0x0;
      fStack_c78 = 0.0;
      fStack_c74 = 0.0;
      fStack_c70 = 0.0;
      afStack_c6c[1] = 0.0;
      iStack_c48 = 0;
      afStack_c6c[0] = fStack_c78;
      iStack_c58 = (int)fStack_c74;
      iStack_c54 = (int)fStack_c70;
      iStack_c50 = (int)fStack_c78;
      fStack_c4c = afStack_c6c[1];
      if (bVar51 || bVar52) goto LAB_001b3436;
LAB_001b0563:
      afStack_c6c[1] = 0.0;
      fStack_c78 = 0.0;
      fStack_c70 = 0.0;
      fStack_c74 = 0.0;
      local_c80 = (undefined1  [8])0x0;
      local_c40[0] = 0;
      iStack_c48 = 0;
      iVar28 = -100;
      local_ed0.cstep = 0;
      local_ed0.data = (Allocator *)0x0;
      local_ed0.refcount._0_4_ = 0;
      local_ed0.refcount._4_4_ = 0;
      local_ed0.elemsize._0_4_ = 0;
      local_ed0.elempack = 0;
      local_ed0.elemsize._4_4_ = (int)local_ed0.refcount;
      local_ed0.allocator = (Allocator *)local_ed0.data;
      local_ed0.dims = (int)local_ed0.refcount;
      local_ed0.w = local_ed0.refcount._4_4_;
      local_ed0.h = (int)local_ed0.elemsize;
      local_ed0.d = (int)local_ed0.refcount;
      local_ed0.c = local_ed0.elempack;
      afStack_c6c[0] = fStack_c78;
      iStack_c58 = (int)fStack_c74;
      iStack_c54 = (int)fStack_c70;
      iStack_c50 = (int)fStack_c78;
      fStack_c4c = afStack_c6c[1];
      Mat::create(&local_ed0,local_f34 * local_ed4 * 0x40,1,nT,4,opt->workspace_allocator);
      if (((Allocator *)local_ed0.data != (Allocator *)0x0) &&
         ((long)local_ed0.c * local_ed0.cstep != 0)) {
        if (0 < local_e24) {
          local_edc = 0;
          do {
            uVar46 = local_ed4;
            iVar11 = get_omp_thread_num();
            uVar32 = CONCAT44(local_ed0.elemsize._4_4_,(int)local_ed0.elemsize);
            local_e00.data =
                 (void *)((long)(_func_int ***)local_ed0.data +
                         (long)iVar11 * local_ed0.cstep * uVar32);
            local_e00.refcount._0_4_ = 0;
            local_e00.refcount._4_4_ = 0;
            local_e00.elemsize._0_4_ = (int)local_ed0.elemsize;
            local_e00.elemsize._4_4_ = local_ed0.elemsize._4_4_;
            local_e00.elempack = local_ed0.elempack;
            local_e00.allocator = local_ed0.allocator;
            local_e00.w = local_ed0.w;
            local_e00.h = local_ed0.h;
            local_e00.d = 1;
            local_e00.c = local_ed0.d;
            local_e00.dims = local_ed0.dims + -1;
            local_e00.cstep =
                 (uVar32 * (long)local_ed0.h * (long)local_ed0.w + 0xf & 0xfffffffffffffff0) /
                 uVar32;
            if (local_ed0.dims == 4) {
              local_e00.cstep = (long)local_ed0.h * (long)local_ed0.w;
            }
            uVar50 = uVar46 * local_edc;
            local_e80 = (ulong)uVar50;
            uVar49 = (int)local_cd0 - uVar50;
            if ((int)uVar46 < (int)uVar49) {
              uVar49 = uVar46;
            }
            auVar71 = vbroadcastss_avx512f(ZEXT416(0x42000000));
            auVar72 = vbroadcastss_avx512f(ZEXT416(0x40000000));
            auVar73 = vbroadcastss_avx512f(ZEXT416(0x41800000));
            auVar74 = vbroadcastss_avx512f(ZEXT416(0x40800000));
            auVar75 = vbroadcastss_avx512f(ZEXT416(0x41000000));
            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x42000000));
            auVar131 = ZEXT3264(auVar65);
            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
            auVar133 = ZEXT3264(auVar65);
            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x41800000));
            auVar135 = ZEXT3264(auVar65);
            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
            auVar137 = ZEXT3264(auVar65);
            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x41000000));
            auVar139 = ZEXT3264(auVar65);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x42000000));
            auVar140 = ZEXT1664(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
            auVar141 = ZEXT1664(auVar53);
            auVar127 = ZEXT1664(CONCAT412(0x41800000,CONCAT48(0x41800000,0x4180000041800000)));
            auVar128 = ZEXT1664(CONCAT412(0x40800000,CONCAT48(0x40800000,0x4080000040800000)));
            auVar129 = ZEXT1664(CONCAT412(0x41000000,CONCAT48(0x41000000,0x4100000041000000)));
            if (0 < (int)local_e20) {
              local_ee8 = (long)(int)uVar50;
              local_c90 = (ulong)uVar49;
              local_e08 = (long)(int)uVar49;
              uVar32 = 0;
              do {
                uVar46 = (int)local_e20 - (int)uVar32;
                if ((int)local_f34 < (int)uVar46) {
                  uVar46 = local_f34;
                }
                local_f30 = (ulong)uVar46;
                local_f08 = uVar32;
                if (0 < (int)local_e10) {
                  iVar11 = 0;
                  do {
                    iVar33 = (int)local_e10 - iVar11;
                    if (local_f38 < iVar33) {
                      iVar33 = local_f38;
                    }
                    iStack_c54 = local_c88->w;
                    iStack_c50 = local_c88->h;
                    sVar7 = local_c88->elemsize;
                    afStack_c6c[1] = (float)local_c88->elempack;
                    pAStack_c60 = local_c88->allocator;
                    local_c40[0] = (long)iStack_c50 * (long)iStack_c54;
                    local_c80 = (undefined1  [8])
                                ((long)local_c88->data +
                                sVar7 * local_c40[0] * (long)(iVar11 / local_f38) +
                                (long)(int)((long)((ulong)(uint)((int)local_e80 >> 0x1f) << 0x20 |
                                                  local_e80 & 0xffffffff) / (long)(int)local_ed4) *
                                local_c88->cstep * sVar7);
                    fStack_c78 = 0.0;
                    fStack_c74 = 0.0;
                    fStack_c70 = (float)sVar7;
                    afStack_c6c[0] = (float)(sVar7 >> 0x20);
                    iStack_c58 = 2;
                    fStack_c4c = 1.4013e-45;
                    iStack_c48 = 1;
                    local_d20.cstep = (long)local_db0.h * (long)local_db0.w;
                    local_d20.data =
                         (void *)((long)local_db0.data +
                                 CONCAT44(local_db0.elemsize._4_4_,(undefined4)local_db0.elemsize) *
                                 local_d20.cstep * (long)(iVar11 / local_f38) +
                                 (long)(int)((long)((ulong)(uint)((int)local_f08 >> 0x1f) << 0x20 |
                                                   local_f08 & 0xffffffff) / (long)(int)local_f34) *
                                 local_db0.cstep *
                                 CONCAT44(local_db0.elemsize._4_4_,(undefined4)local_db0.elemsize));
                    local_d20.refcount._0_4_ = 0;
                    local_d20.refcount._4_4_ = 0;
                    local_d20.elemsize._0_4_ = (undefined4)local_db0.elemsize;
                    local_d20.elemsize._4_4_ = local_db0.elemsize._4_4_;
                    local_d20.elempack = local_db0.elempack;
                    local_d20.allocator = local_db0.allocator;
                    local_d20.w = local_db0.w;
                    local_d20.dims = 2;
                    local_d20.h = local_db0.h;
                    local_d20.d = 1;
                    local_d20.c = 1;
                    gemm_transB_packed_tile
                              ((Mat *)local_c80,&local_d20,&local_e00,0x40,uVar49,(int)local_f30,
                               iVar11,iVar33);
                    piVar10 = (int *)CONCAT44(local_d20.refcount._4_4_,local_d20.refcount._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (local_d20.allocator == (Allocator *)0x0) {
                          if (local_d20.data != (void *)0x0) {
                            free(local_d20.data);
                          }
                        }
                        else {
                          (*(local_d20.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    local_d20.cstep = 0;
                    local_d20.data = (void *)0x0;
                    local_d20.refcount._0_4_ = 0;
                    local_d20.refcount._4_4_ = 0;
                    local_d20.elemsize._0_4_ = 0;
                    local_d20.elemsize._4_4_ = 0;
                    local_d20.elempack = 0;
                    local_d20.dims = 0;
                    local_d20.w = 0;
                    local_d20.h = 0;
                    local_d20.d = 0;
                    local_d20.c = 0;
                    piVar10 = (int *)CONCAT44(fStack_c74,fStack_c78);
                    auVar71 = vbroadcastss_avx512f(ZEXT416(0x42000000));
                    auVar72 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                    auVar73 = vbroadcastss_avx512f(ZEXT416(0x41800000));
                    auVar74 = vbroadcastss_avx512f(ZEXT416(0x40800000));
                    auVar75 = vbroadcastss_avx512f(ZEXT416(0x41000000));
                    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x42000000));
                    auVar131 = ZEXT3264(auVar65);
                    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                    auVar133 = ZEXT3264(auVar65);
                    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x41800000));
                    auVar135 = ZEXT3264(auVar65);
                    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
                    auVar137 = ZEXT3264(auVar65);
                    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x41000000));
                    auVar139 = ZEXT3264(auVar65);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x42000000));
                    auVar140 = ZEXT1664(auVar53);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                    auVar141 = ZEXT1664(auVar53);
                    auVar127 = ZEXT1664(CONCAT412(0x41800000,CONCAT48(0x41800000,0x4180000041800000)
                                                 ));
                    auVar128 = ZEXT1664(CONCAT412(0x40800000,CONCAT48(0x40800000,0x4080000040800000)
                                                 ));
                    auVar129 = ZEXT1664(CONCAT412(0x41000000,CONCAT48(0x41000000,0x4100000041000000)
                                                 ));
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (pAStack_c60 == (Allocator *)0x0) {
                          if (local_c80 != (undefined1  [8])0x0) {
                            free((void *)local_c80);
                            auVar129 = ZEXT1664(CONCAT412(0x41000000,
                                                          CONCAT48(0x41000000,0x4100000041000000)));
                            auVar128 = ZEXT1664(CONCAT412(0x40800000,
                                                          CONCAT48(0x40800000,0x4080000040800000)));
                            auVar127 = ZEXT1664(CONCAT412(0x41800000,
                                                          CONCAT48(0x41800000,0x4180000041800000)));
                            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                            auVar141 = ZEXT1664(auVar53);
                            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x42000000));
                            auVar140 = ZEXT1664(auVar53);
                            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x41000000));
                            auVar139 = ZEXT3264(auVar65);
                            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
                            auVar137 = ZEXT3264(auVar65);
                            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x41800000));
                            auVar135 = ZEXT3264(auVar65);
                            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                            auVar133 = ZEXT3264(auVar65);
                            auVar65 = vbroadcastss_avx512vl(ZEXT416(0x42000000));
                            auVar131 = ZEXT3264(auVar65);
                            auVar75 = vbroadcastss_avx512f(ZEXT416(0x41000000));
                            auVar74 = vbroadcastss_avx512f(ZEXT416(0x40800000));
                            auVar73 = vbroadcastss_avx512f(ZEXT416(0x41800000));
                            auVar72 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                            auVar71 = vbroadcastss_avx512f(ZEXT416(0x42000000));
                          }
                        }
                        else {
                          (*pAStack_c60->_vptr_Allocator[3])();
                          auVar129 = ZEXT1664(CONCAT412(0x41000000,
                                                        CONCAT48(0x41000000,0x4100000041000000)));
                          auVar128 = ZEXT1664(CONCAT412(0x40800000,
                                                        CONCAT48(0x40800000,0x4080000040800000)));
                          auVar127 = ZEXT1664(CONCAT412(0x41800000,
                                                        CONCAT48(0x41800000,0x4180000041800000)));
                          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                          auVar141 = ZEXT1664(auVar53);
                          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x42000000));
                          auVar140 = ZEXT1664(auVar53);
                          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x41000000));
                          auVar139 = ZEXT3264(auVar65);
                          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
                          auVar137 = ZEXT3264(auVar65);
                          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x41800000));
                          auVar135 = ZEXT3264(auVar65);
                          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                          auVar133 = ZEXT3264(auVar65);
                          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x42000000));
                          auVar131 = ZEXT3264(auVar65);
                          auVar75 = vbroadcastss_avx512f(ZEXT416(0x41000000));
                          auVar74 = vbroadcastss_avx512f(ZEXT416(0x40800000));
                          auVar73 = vbroadcastss_avx512f(ZEXT416(0x41800000));
                          auVar72 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                          auVar71 = vbroadcastss_avx512f(ZEXT416(0x42000000));
                        }
                      }
                    }
                    local_c40[0] = 0;
                    auVar53 = ZEXT816(0);
                    auVar58 = auVar53 << 0x40;
                    local_c80 = auVar58._0_8_;
                    local_c80 = (undefined1  [8])0x0;
                    fStack_c78 = auVar53._0_4_;
                    fStack_c78 = 0.0;
                    fStack_c74 = auVar58._0_4_;
                    fStack_c74 = 0.0;
                    fStack_c70 = auVar58._4_4_;
                    fStack_c70 = 0.0;
                    afStack_c6c[1] = auVar53._4_4_;
                    afStack_c6c[1] = 0.0;
                    iStack_c48 = 0;
                    iVar11 = iVar11 + local_f38;
                    afStack_c6c[0] = fStack_c78;
                    iStack_c58 = (int)fStack_c74;
                    iStack_c54 = (int)fStack_c70;
                    iStack_c50 = (int)fStack_c78;
                    fStack_c4c = afStack_c6c[1];
                  } while (iVar11 < (int)local_e10);
                }
                iVar11 = local_e88->w;
                iVar33 = local_e88->elempack;
                uVar50 = (int)local_e88->cstep * iVar33;
                local_e18 = (ulong)uVar50;
                uVar46 = (iVar11 + 5) / 6;
                local_e38 = (ulong)uVar46;
                iVar47 = (int)local_f30;
                local_ed8 = iVar47 * 0x40;
                uVar32 = 0;
                local_e40 = (long)local_e88->h;
                local_f18 = local_cc8->data;
                iVar41 = (int)local_e80;
                iVar28 = (int)local_f08;
                if (0xf < (int)uVar49) {
                  lVar43 = (long)(int)uVar50;
                  local_d58 = (long)(int)(uVar50 * 2);
                  local_d60 = (void *)(long)(int)(uVar50 * 3);
                  local_d48 = (long)(int)(uVar50 * 4);
                  lVar30 = (long)(int)(uVar50 * 5);
                  lVar13 = (long)(int)(uVar50 * 6);
                  lVar45 = (long)(int)(uVar50 * 8);
                  lVar14 = (long)(int)(uVar50 * 7);
                  lVar15 = (long)(int)(uVar50 * 9);
                  lVar16 = (long)(int)(uVar50 * 10);
                  lVar17 = (long)(int)(uVar50 * 0xb);
                  lVar18 = (long)(int)(uVar50 * 0xc);
                  lVar19 = (long)(int)(uVar50 * 0xd);
                  lVar20 = (long)(int)(uVar50 * 0xe);
                  lVar21 = (long)(int)(uVar50 * 0xf);
                  local_e30 = (long)(iVar33 * iVar11);
                  local_d3c = iVar47 * 0x400;
                  local_e78 = (void *)((long)(iVar47 << 7) * 4);
                  local_c98 = (long)(iVar47 * 0x10) * 4;
                  local_ca0 = (long)(iVar47 * 0x20) * 4;
                  local_ca8 = (long)(iVar47 * 0x30) * 4;
                  local_cb8 = (long)local_ed8 * 4;
                  local_cb0 = (long)(iVar47 * 0x50) * 4;
                  local_d30 = (long)(iVar47 * 0x60) * 4;
                  local_d38 = (long)(iVar47 * 0x70) * 4;
                  local_cc0 = (void *)((long)local_f18 + local_ee8 * 4);
                  local_d50 = (void *)(local_f30 & 0xffffffff);
                  local_d68 = 0;
                  uVar32 = 0;
                  do {
                    local_d28 = uVar32;
                    if (local_f18 == (void *)0x0) {
                      auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    else {
                      auVar87 = *(undefined1 (*) [64])((long)local_cc0 + local_d28 * 4);
                    }
                    if (0 < iVar47) {
                      lVar22 = (long)(int)local_d68;
                      local_ef0 = local_c98 + lVar22 * 4;
                      local_e58 = local_ca0 + lVar22 * 4;
                      local_e60 = local_ca8 + lVar22 * 4;
                      local_e68 = local_d38 + lVar22 * 4;
                      local_e70 = (long)((iVar41 + (int)local_d28) / iVar33);
                      pvVar26 = (void *)0x0;
                      lVar31 = 0;
                      do {
                        local_e48 = lVar31;
                        local_e50 = pvVar26;
                        iVar34 = iVar28 + (int)local_e50;
                        lVar31 = (long)local_e00.data + local_e48;
                        lVar35 = -0x200;
                        do {
                          auVar79 = *(undefined1 (*) [64])(lVar31 + local_cb8 + lVar22 * 4);
                          auVar81 = *(undefined1 (*) [64])(lVar31 + local_cb0 + lVar22 * 4);
                          auVar82 = *(undefined1 (*) [64])(lVar31 + local_d30 + lVar22 * 4);
                          auVar76 = vaddps_avx512f(*(undefined1 (*) [64])(lVar31 + local_e58),
                                                   *(undefined1 (*) [64])(lVar31 + local_ef0));
                          auVar77 = vsubps_avx512f(*(undefined1 (*) [64])(lVar31 + local_ef0),
                                                   *(undefined1 (*) [64])(lVar31 + local_e58));
                          auVar78 = vaddps_avx512f(auVar79,*(undefined1 (*) [64])
                                                            (lVar31 + local_e60));
                          auVar79 = vsubps_avx512f(*(undefined1 (*) [64])(lVar31 + local_e60),
                                                   auVar79);
                          auVar80 = vaddps_avx512f(auVar82,auVar81);
                          auVar81 = vsubps_avx512f(auVar81,auVar82);
                          auVar82 = vaddps_avx512f(auVar76,*(undefined1 (*) [64])
                                                            (lVar31 + lVar22 * 4));
                          auVar83 = vfmadd213ps_avx512f(auVar71,auVar80,auVar78);
                          auVar82 = vaddps_avx512f(auVar82,auVar83);
                          auVar83 = vfmadd213ps_avx512f(auVar72,auVar79,auVar77);
                          auVar83 = vfmadd231ps_avx512f(auVar83,auVar81,auVar73);
                          auVar84 = vfmadd213ps_avx512f(auVar74,auVar78,auVar76);
                          auVar84 = vfmadd231ps_avx512f(auVar84,auVar80,auVar75);
                          auVar85 = vfmadd213ps_avx512f(auVar75,auVar79,auVar77);
                          auVar85 = vfmadd231ps_avx512f(auVar85,auVar81,auVar74);
                          auVar76 = vfmadd213ps_avx512f(auVar78,auVar73,auVar76);
                          auVar76 = vfmadd231ps_avx512f(auVar76,auVar72,auVar80);
                          auVar77 = vaddps_avx512f(auVar77,*(undefined1 (*) [64])
                                                            (lVar31 + local_e68));
                          auVar79 = vfmadd213ps_avx512f(auVar79,auVar71,auVar81);
                          auVar79 = vaddps_avx512f(auVar77,auVar79);
                          *(undefined1 (*) [64])(auStack_a80 + lVar35) = auVar82;
                          *(undefined1 (*) [64])(auStack_880 + lVar35) = auVar83;
                          *(undefined1 (*) [64])(auStack_680 + lVar35) = auVar84;
                          *(undefined1 (*) [64])(auStack_480 + lVar35) = auVar85;
                          *(undefined1 (*) [64])(auStack_280 + lVar35) = auVar76;
                          *(undefined1 (*) [64])(auStack_80 + lVar35) = auVar79;
                          lVar31 = lVar31 + (long)local_e78;
                          lVar35 = lVar35 + 0x40;
                        } while (lVar35 != 0);
                        iVar29 = iVar34 % (int)uVar46;
                        lVar35 = (long)((iVar34 / (int)uVar46) * 6);
                        pauVar23 = (undefined1 (*) [64])
                                   ((long)local_e88->data +
                                   (long)(iVar29 * 6 * iVar33) * 4 +
                                   (long)local_e88->w * local_e88->elemsize * lVar35 +
                                   local_e88->cstep * local_e70 * local_e88->elemsize);
                        iVar44 = iVar29 * 6 + 1;
                        local_f20 = CONCAT44(local_f20._4_4_,iVar44);
                        iVar34 = iVar29 * 6 + 2;
                        local_f28 = (void *)CONCAT44(local_f28._4_4_,iVar34);
                        iVar12 = iVar29 * 6 + 3;
                        local_ef8 = (_func_int ***)CONCAT44(local_ef8._4_4_,iVar12);
                        iVar1 = iVar29 * 6 + 4;
                        local_f00 = (void *)CONCAT44(local_f00._4_4_,iVar1);
                        iVar29 = iVar29 * 6 + 5;
                        local_f10 = CONCAT44(local_f10._4_4_,iVar29);
                        pauVar48 = &local_ac0;
                        lVar31 = 0;
                        do {
                          if (lVar31 < local_e40 - lVar35) {
                            auVar79 = vaddps_avx512f(pauVar48[-5],pauVar48[-6]);
                            auVar81 = vsubps_avx512f(pauVar48[-6],pauVar48[-5]);
                            auVar82 = vaddps_avx512f(pauVar48[-3],pauVar48[-4]);
                            auVar76 = vsubps_avx512f(pauVar48[-4],pauVar48[-3]);
                            auVar77 = vaddps_avx512f(pauVar48[-1],pauVar48[-2]);
                            auVar78 = vsubps_avx512f(pauVar48[-2],pauVar48[-1]);
                            auVar80 = vaddps_avx512f(auVar87,pauVar48[-7]);
                            auVar83 = vfmadd213ps_avx512f(auVar71,auVar77,auVar82);
                            auVar80 = vaddps_avx512f(auVar80,auVar79);
                            auVar80 = vaddps_avx512f(auVar80,auVar83);
                            auVar83 = vfmadd213ps_avx512f(auVar72,auVar76,auVar81);
                            auVar83 = vfmadd231ps_avx512f(auVar83,auVar78,auVar73);
                            auVar83 = vaddps_avx512f(auVar83,auVar87);
                            auVar84 = vfmadd213ps_avx512f(auVar74,auVar82,auVar79);
                            auVar84 = vfmadd231ps_avx512f(auVar84,auVar77,auVar75);
                            auVar84 = vaddps_avx512f(auVar84,auVar87);
                            auVar85 = vfmadd213ps_avx512f(auVar75,auVar76,auVar81);
                            auVar85 = vfmadd231ps_avx512f(auVar85,auVar78,auVar74);
                            auVar85 = vaddps_avx512f(auVar85,auVar87);
                            auVar79 = vfmadd213ps_avx512f(auVar82,auVar73,auVar79);
                            auVar79 = vfmadd231ps_avx512f(auVar79,auVar72,auVar77);
                            auVar79 = vaddps_avx512f(auVar79,auVar87);
                            auVar82 = vfmadd213ps_avx512f(auVar76,auVar71,auVar78);
                            auVar81 = vaddps_avx512f(auVar81,auVar87);
                            auVar81 = vaddps_avx512f(auVar81,*pauVar48);
                            auVar81 = vaddps_avx512f(auVar81,auVar82);
                            auVar54 = auVar80._0_16_;
                            auVar55 = auVar83._0_16_;
                            auVar56 = auVar84._0_16_;
                            auVar57 = auVar85._0_16_;
                            auVar58 = auVar79._0_16_;
                            auVar53 = auVar81._0_16_;
                            if (iVar33 < 8) {
LAB_001b138a:
                              if (iVar33 == 1) {
                                *(int *)*pauVar23 = auVar80._0_4_;
                                uVar6 = vextractps_avx(auVar54,1);
                                *(undefined4 *)(*pauVar23 + lVar43 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar54,2);
                                *(undefined4 *)(*pauVar23 + local_d58 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar54,3);
                                *(undefined4 *)(*pauVar23 + (long)local_d60 * 4) = uVar6;
                                auVar54 = auVar80._16_16_;
                                *(int *)(*pauVar23 + local_d48 * 4) = auVar80._16_4_;
                                uVar6 = vextractps_avx(auVar54,1);
                                *(undefined4 *)(*pauVar23 + lVar30 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar54,2);
                                *(undefined4 *)(*pauVar23 + lVar13 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar54,3);
                                *(undefined4 *)(*pauVar23 + lVar14 * 4) = uVar6;
                                auVar54 = vextracti32x4_avx512f(auVar80,2);
                                *(int *)(*pauVar23 + lVar45 * 4) = auVar54._0_4_;
                                uVar6 = vextractps_avx(auVar54,1);
                                *(undefined4 *)(*pauVar23 + lVar15 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar54,2);
                                *(undefined4 *)(*pauVar23 + lVar16 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar54,3);
                                *(undefined4 *)(*pauVar23 + lVar17 * 4) = uVar6;
                                auVar54 = vextracti32x4_avx512f(auVar80,3);
                                *(int *)(*pauVar23 + lVar18 * 4) = auVar54._0_4_;
                                uVar6 = vextractps_avx(auVar54,1);
                                *(undefined4 *)(*pauVar23 + lVar19 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar54,2);
                                *(undefined4 *)(*pauVar23 + lVar20 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar54,3);
                                *(undefined4 *)(*pauVar23 + lVar21 * 4) = uVar6;
                                if (iVar44 < iVar11) {
                                  *(int *)(*pauVar23 + 4) = auVar83._0_4_;
                                  uVar6 = vextractps_avx(auVar55,1);
                                  *(undefined4 *)(*pauVar23 + lVar43 * 4 + 4) = uVar6;
                                  uVar6 = vextractps_avx(auVar55,2);
                                  *(undefined4 *)(*pauVar23 + local_d58 * 4 + 4) = uVar6;
                                  uVar6 = vextractps_avx(auVar55,3);
                                  *(undefined4 *)(*pauVar23 + (long)local_d60 * 4 + 4) = uVar6;
                                  auVar55 = auVar83._16_16_;
                                  *(int *)(*pauVar23 + local_d48 * 4 + 4) = auVar83._16_4_;
                                  uVar6 = vextractps_avx(auVar55,1);
                                  *(undefined4 *)(*pauVar23 + lVar30 * 4 + 4) = uVar6;
                                  uVar6 = vextractps_avx(auVar55,2);
                                  *(undefined4 *)(*pauVar23 + lVar13 * 4 + 4) = uVar6;
                                  uVar6 = vextractps_avx(auVar55,3);
                                  *(undefined4 *)(*pauVar23 + lVar14 * 4 + 4) = uVar6;
                                  auVar55 = vextracti32x4_avx512f(auVar83,2);
                                  *(int *)(*pauVar23 + lVar45 * 4 + 4) = auVar55._0_4_;
                                  uVar6 = vextractps_avx(auVar55,1);
                                  *(undefined4 *)(*pauVar23 + lVar15 * 4 + 4) = uVar6;
                                  uVar6 = vextractps_avx(auVar55,2);
                                  *(undefined4 *)(*pauVar23 + lVar16 * 4 + 4) = uVar6;
                                  uVar6 = vextractps_avx(auVar55,3);
                                  *(undefined4 *)(*pauVar23 + lVar17 * 4 + 4) = uVar6;
                                  auVar55 = vextracti32x4_avx512f(auVar83,3);
                                  *(int *)(*pauVar23 + lVar18 * 4 + 4) = auVar55._0_4_;
                                  uVar6 = vextractps_avx(auVar55,1);
                                  *(undefined4 *)(*pauVar23 + lVar19 * 4 + 4) = uVar6;
                                  uVar6 = vextractps_avx(auVar55,2);
                                  *(undefined4 *)(*pauVar23 + lVar20 * 4 + 4) = uVar6;
                                  uVar6 = vextractps_avx(auVar55,3);
                                  *(undefined4 *)(*pauVar23 + lVar21 * 4 + 4) = uVar6;
                                }
                                if (iVar34 < iVar11) {
                                  *(int *)(*pauVar23 + 8) = auVar84._0_4_;
                                  uVar6 = vextractps_avx(auVar56,1);
                                  *(undefined4 *)(*pauVar23 + lVar43 * 4 + 8) = uVar6;
                                  uVar6 = vextractps_avx(auVar56,2);
                                  *(undefined4 *)(*pauVar23 + local_d58 * 4 + 8) = uVar6;
                                  uVar6 = vextractps_avx(auVar56,3);
                                  *(undefined4 *)(*pauVar23 + (long)local_d60 * 4 + 8) = uVar6;
                                  auVar56 = auVar84._16_16_;
                                  *(int *)(*pauVar23 + local_d48 * 4 + 8) = auVar84._16_4_;
                                  uVar6 = vextractps_avx(auVar56,1);
                                  *(undefined4 *)(*pauVar23 + lVar30 * 4 + 8) = uVar6;
                                  uVar6 = vextractps_avx(auVar56,2);
                                  *(undefined4 *)(*pauVar23 + lVar13 * 4 + 8) = uVar6;
                                  uVar6 = vextractps_avx(auVar56,3);
                                  *(undefined4 *)(*pauVar23 + lVar14 * 4 + 8) = uVar6;
                                  auVar56 = vextracti32x4_avx512f(auVar84,2);
                                  *(int *)(*pauVar23 + lVar45 * 4 + 8) = auVar56._0_4_;
                                  uVar6 = vextractps_avx(auVar56,1);
                                  *(undefined4 *)(*pauVar23 + lVar15 * 4 + 8) = uVar6;
                                  uVar6 = vextractps_avx(auVar56,2);
                                  *(undefined4 *)(*pauVar23 + lVar16 * 4 + 8) = uVar6;
                                  uVar6 = vextractps_avx(auVar56,3);
                                  *(undefined4 *)(*pauVar23 + lVar17 * 4 + 8) = uVar6;
                                  auVar56 = vextracti32x4_avx512f(auVar84,3);
                                  *(int *)(*pauVar23 + lVar18 * 4 + 8) = auVar56._0_4_;
                                  uVar6 = vextractps_avx(auVar56,1);
                                  *(undefined4 *)(*pauVar23 + lVar19 * 4 + 8) = uVar6;
                                  uVar6 = vextractps_avx(auVar56,2);
                                  *(undefined4 *)(*pauVar23 + lVar20 * 4 + 8) = uVar6;
                                  uVar6 = vextractps_avx(auVar56,3);
                                  *(undefined4 *)(*pauVar23 + lVar21 * 4 + 8) = uVar6;
                                }
                                if (iVar12 < iVar11) {
                                  *(int *)(*pauVar23 + 0xc) = auVar85._0_4_;
                                  uVar6 = vextractps_avx(auVar57,1);
                                  *(undefined4 *)(*pauVar23 + lVar43 * 4 + 0xc) = uVar6;
                                  uVar6 = vextractps_avx(auVar57,2);
                                  *(undefined4 *)(*pauVar23 + local_d58 * 4 + 0xc) = uVar6;
                                  uVar6 = vextractps_avx(auVar57,3);
                                  *(undefined4 *)(*pauVar23 + (long)local_d60 * 4 + 0xc) = uVar6;
                                  auVar57 = auVar85._16_16_;
                                  *(int *)(*pauVar23 + local_d48 * 4 + 0xc) = auVar85._16_4_;
                                  uVar6 = vextractps_avx(auVar57,1);
                                  *(undefined4 *)(*pauVar23 + lVar30 * 4 + 0xc) = uVar6;
                                  uVar6 = vextractps_avx(auVar57,2);
                                  *(undefined4 *)(*pauVar23 + lVar13 * 4 + 0xc) = uVar6;
                                  uVar6 = vextractps_avx(auVar57,3);
                                  *(undefined4 *)(*pauVar23 + lVar14 * 4 + 0xc) = uVar6;
                                  auVar57 = vextracti32x4_avx512f(auVar85,2);
                                  *(int *)(*pauVar23 + lVar45 * 4 + 0xc) = auVar57._0_4_;
                                  uVar6 = vextractps_avx(auVar57,1);
                                  *(undefined4 *)(*pauVar23 + lVar15 * 4 + 0xc) = uVar6;
                                  uVar6 = vextractps_avx(auVar57,2);
                                  *(undefined4 *)(*pauVar23 + lVar16 * 4 + 0xc) = uVar6;
                                  uVar6 = vextractps_avx(auVar57,3);
                                  *(undefined4 *)(*pauVar23 + lVar17 * 4 + 0xc) = uVar6;
                                  auVar57 = vextracti32x4_avx512f(auVar85,3);
                                  *(int *)(*pauVar23 + lVar18 * 4 + 0xc) = auVar57._0_4_;
                                  uVar6 = vextractps_avx(auVar57,1);
                                  *(undefined4 *)(*pauVar23 + lVar19 * 4 + 0xc) = uVar6;
                                  uVar6 = vextractps_avx(auVar57,2);
                                  *(undefined4 *)(*pauVar23 + lVar20 * 4 + 0xc) = uVar6;
                                  uVar6 = vextractps_avx(auVar57,3);
                                  *(undefined4 *)(*pauVar23 + lVar21 * 4 + 0xc) = uVar6;
                                }
                                if (iVar1 < iVar11) {
                                  *(int *)(*pauVar23 + 0x10) = auVar79._0_4_;
                                  uVar6 = vextractps_avx(auVar58,1);
                                  *(undefined4 *)(*pauVar23 + lVar43 * 4 + 0x10) = uVar6;
                                  uVar6 = vextractps_avx(auVar58,2);
                                  *(undefined4 *)(*pauVar23 + local_d58 * 4 + 0x10) = uVar6;
                                  uVar6 = vextractps_avx(auVar58,3);
                                  *(undefined4 *)(*pauVar23 + (long)local_d60 * 4 + 0x10) = uVar6;
                                  auVar58 = auVar79._16_16_;
                                  *(int *)(*pauVar23 + local_d48 * 4 + 0x10) = auVar79._16_4_;
                                  uVar6 = vextractps_avx(auVar58,1);
                                  *(undefined4 *)(*pauVar23 + lVar30 * 4 + 0x10) = uVar6;
                                  uVar6 = vextractps_avx(auVar58,2);
                                  *(undefined4 *)(*pauVar23 + lVar13 * 4 + 0x10) = uVar6;
                                  uVar6 = vextractps_avx(auVar58,3);
                                  *(undefined4 *)(*pauVar23 + lVar14 * 4 + 0x10) = uVar6;
                                  auVar58 = vextracti32x4_avx512f(auVar79,2);
                                  *(int *)(*pauVar23 + lVar45 * 4 + 0x10) = auVar58._0_4_;
                                  uVar6 = vextractps_avx(auVar58,1);
                                  *(undefined4 *)(*pauVar23 + lVar15 * 4 + 0x10) = uVar6;
                                  uVar6 = vextractps_avx(auVar58,2);
                                  *(undefined4 *)(*pauVar23 + lVar16 * 4 + 0x10) = uVar6;
                                  uVar6 = vextractps_avx(auVar58,3);
                                  *(undefined4 *)(*pauVar23 + lVar17 * 4 + 0x10) = uVar6;
                                  auVar58 = vextracti32x4_avx512f(auVar79,3);
                                  *(int *)(*pauVar23 + lVar18 * 4 + 0x10) = auVar58._0_4_;
                                  uVar6 = vextractps_avx(auVar58,1);
                                  *(undefined4 *)(*pauVar23 + lVar19 * 4 + 0x10) = uVar6;
                                  uVar6 = vextractps_avx(auVar58,2);
                                  *(undefined4 *)(*pauVar23 + lVar20 * 4 + 0x10) = uVar6;
                                  uVar6 = vextractps_avx(auVar58,3);
                                  *(undefined4 *)(*pauVar23 + lVar21 * 4 + 0x10) = uVar6;
                                }
                                if (iVar29 < iVar11) {
                                  *(int *)(*pauVar23 + 0x14) = auVar81._0_4_;
                                  uVar6 = vextractps_avx(auVar53,1);
                                  *(undefined4 *)(*pauVar23 + lVar43 * 4 + 0x14) = uVar6;
                                  uVar6 = vextractps_avx(auVar53,2);
                                  *(undefined4 *)(*pauVar23 + local_d58 * 4 + 0x14) = uVar6;
                                  uVar6 = vextractps_avx(auVar53,3);
                                  *(undefined4 *)(*pauVar23 + (long)local_d60 * 4 + 0x14) = uVar6;
                                  auVar53 = auVar81._16_16_;
                                  *(int *)(*pauVar23 + local_d48 * 4 + 0x14) = auVar81._16_4_;
                                  uVar6 = vextractps_avx(auVar53,1);
                                  *(undefined4 *)(*pauVar23 + lVar30 * 4 + 0x14) = uVar6;
                                  uVar6 = vextractps_avx(auVar53,2);
                                  *(undefined4 *)(*pauVar23 + lVar13 * 4 + 0x14) = uVar6;
                                  uVar6 = vextractps_avx(auVar53,3);
                                  *(undefined4 *)(*pauVar23 + lVar14 * 4 + 0x14) = uVar6;
                                  auVar53 = vextracti32x4_avx512f(auVar81,2);
                                  *(int *)(*pauVar23 + lVar45 * 4 + 0x14) = auVar53._0_4_;
                                  uVar6 = vextractps_avx(auVar53,1);
                                  *(undefined4 *)(*pauVar23 + lVar15 * 4 + 0x14) = uVar6;
                                  uVar6 = vextractps_avx(auVar53,2);
                                  *(undefined4 *)(*pauVar23 + lVar16 * 4 + 0x14) = uVar6;
                                  uVar6 = vextractps_avx(auVar53,3);
                                  *(undefined4 *)(*pauVar23 + lVar17 * 4 + 0x14) = uVar6;
                                  auVar53 = vextracti32x4_avx512f(auVar81,3);
                                  *(int *)(*pauVar23 + lVar18 * 4 + 0x14) = auVar53._0_4_;
                                  uVar6 = vextractps_avx(auVar53,1);
                                  *(undefined4 *)(*pauVar23 + lVar19 * 4 + 0x14) = uVar6;
                                  uVar6 = vextractps_avx(auVar53,2);
                                  *(undefined4 *)(*pauVar23 + lVar20 * 4 + 0x14) = uVar6;
                                  uVar6 = vextractps_avx(auVar53,3);
                                  *(undefined4 *)(*pauVar23 + lVar21 * 4 + 0x14) = uVar6;
                                }
                              }
                              else if (iVar33 == 4) {
                                *(undefined1 (*) [16])*pauVar23 = auVar54;
                                auVar54 = vextractf32x4_avx512f(auVar80,1);
                                *(undefined1 (*) [16])(*pauVar23 + lVar43 * 4) = auVar54;
                                auVar54 = vextractf32x4_avx512f(auVar80,2);
                                *(undefined1 (*) [16])(*pauVar23 + local_d58 * 4) = auVar54;
                                auVar54 = vextractf32x4_avx512f(auVar80,3);
                                *(undefined1 (*) [16])(*pauVar23 + (long)local_d60 * 4) = auVar54;
                                if (iVar44 < iVar11) {
                                  *(undefined1 (*) [16])(*pauVar23 + 0x10) = auVar55;
                                  auVar55 = vextractf32x4_avx512f(auVar83,1);
                                  *(undefined1 (*) [16])(*pauVar23 + lVar43 * 4 + 8) = auVar55;
                                  auVar55 = vextractf32x4_avx512f(auVar83,2);
                                  *(undefined1 (*) [16])(*pauVar23 + local_d58 * 4 + 8) = auVar55;
                                  auVar55 = vextractf32x4_avx512f(auVar83,3);
                                  *(undefined1 (*) [16])(*pauVar23 + (long)local_d60 * 4 + 8) =
                                       auVar55;
                                }
                                if (iVar34 < iVar11) {
                                  *(undefined1 (*) [16])(*pauVar23 + 0x20) = auVar56;
                                  auVar56 = vextractf32x4_avx512f(auVar84,1);
                                  *(undefined1 (*) [16])(*pauVar23 + lVar43 * 4 + 0x10) = auVar56;
                                  auVar56 = vextractf32x4_avx512f(auVar84,2);
                                  *(undefined1 (*) [16])(*pauVar23 + local_d58 * 4 + 0x10) = auVar56
                                  ;
                                  auVar56 = vextractf32x4_avx512f(auVar84,3);
                                  *(undefined1 (*) [16])(*pauVar23 + (long)local_d60 * 4 + 0x10) =
                                       auVar56;
                                }
                                if (iVar12 < iVar11) {
                                  *(undefined1 (*) [16])(*pauVar23 + 0x30) = auVar57;
                                  auVar57 = vextractf32x4_avx512f(auVar85,1);
                                  *(undefined1 (*) [16])(*pauVar23 + lVar43 * 4 + 0x18) = auVar57;
                                  auVar57 = vextractf32x4_avx512f(auVar85,2);
                                  *(undefined1 (*) [16])(*pauVar23 + local_d58 * 4 + 0x18) = auVar57
                                  ;
                                  auVar57 = vextractf32x4_avx512f(auVar85,3);
                                  *(undefined1 (*) [16])(*pauVar23 + (long)local_d60 * 4 + 0x18) =
                                       auVar57;
                                }
                                if (iVar1 < iVar11) {
                                  *(undefined1 (*) [16])pauVar23[1] = auVar58;
                                  auVar58 = vextractf32x4_avx512f(auVar79,1);
                                  *(undefined1 (*) [16])(*pauVar23 + lVar43 * 4 + 0x20) = auVar58;
                                  auVar58 = vextractf32x4_avx512f(auVar79,2);
                                  *(undefined1 (*) [16])(*pauVar23 + local_d58 * 4 + 0x20) = auVar58
                                  ;
                                  auVar58 = vextractf32x4_avx512f(auVar79,3);
                                  *(undefined1 (*) [16])(*pauVar23 + (long)local_d60 * 4 + 0x20) =
                                       auVar58;
                                }
                                if (iVar29 < iVar11) {
                                  *(undefined1 (*) [16])(pauVar23[1] + 0x10) = auVar53;
                                  auVar53 = vextractf32x4_avx512f(auVar81,1);
                                  *(undefined1 (*) [16])(*pauVar23 + lVar43 * 4 + 0x28) = auVar53;
                                  auVar53 = vextractf32x4_avx512f(auVar81,2);
                                  *(undefined1 (*) [16])(*pauVar23 + local_d58 * 4 + 0x28) = auVar53
                                  ;
                                  auVar53 = vextractf32x4_avx512f(auVar81,3);
                                  *(undefined1 (*) [16])(*pauVar23 + (long)local_d60 * 4 + 0x28) =
                                       auVar53;
                                }
                              }
                            }
                            else {
                              if (iVar33 == 8) {
                                *(undefined1 (*) [32])*pauVar23 = auVar80._0_32_;
                                auVar65 = vextractf64x4_avx512f(auVar80,1);
                                *(undefined1 (*) [32])(*pauVar23 + lVar43 * 4) = auVar65;
                                if (iVar44 < iVar11) {
                                  *(undefined1 (*) [32])(*pauVar23 + 0x20) = auVar83._0_32_;
                                  auVar65 = vextractf64x4_avx512f(auVar83,1);
                                  *(undefined1 (*) [32])(*pauVar23 + lVar43 * 4 + 0x10) = auVar65;
                                }
                                if (iVar34 < iVar11) {
                                  *(undefined1 (*) [32])pauVar23[1] = auVar84._0_32_;
                                  auVar65 = vextractf64x4_avx512f(auVar84,1);
                                  *(undefined1 (*) [32])(*pauVar23 + lVar43 * 4 + 0x20) = auVar65;
                                }
                                if (iVar12 < iVar11) {
                                  *(undefined1 (*) [32])(pauVar23[1] + 0x20) = auVar85._0_32_;
                                  auVar65 = vextractf64x4_avx512f(auVar85,1);
                                  *(undefined1 (*) [32])(*pauVar23 + lVar43 * 4 + 0x30) = auVar65;
                                }
                                if (iVar1 < iVar11) {
                                  *(undefined1 (*) [32])pauVar23[2] = auVar79._0_32_;
                                  auVar65 = vextractf64x4_avx512f(auVar79,1);
                                  *(undefined1 (*) [32])(pauVar23[1] + lVar43 * 4) = auVar65;
                                }
                                if (iVar29 < iVar11) {
                                  *(undefined1 (*) [32])(pauVar23[2] + 0x20) = auVar81._0_32_;
                                  auVar65 = vextractf64x4_avx512f(auVar81,1);
                                  *(undefined1 (*) [32])(pauVar23[1] + lVar43 * 4 + 0x10) = auVar65;
                                }
                                goto LAB_001b138a;
                              }
                              if (iVar33 == 0x10) {
                                *pauVar23 = auVar80;
                                if (iVar44 < iVar11) {
                                  pauVar23[1] = auVar83;
                                }
                                if (iVar34 < iVar11) {
                                  pauVar23[2] = auVar84;
                                }
                                if (iVar12 < iVar11) {
                                  pauVar23[3] = auVar85;
                                }
                                if (iVar1 < iVar11) {
                                  pauVar23[4] = auVar79;
                                }
                                if (iVar29 < iVar11) {
                                  pauVar23[5] = auVar81;
                                }
                              }
                            }
                            pauVar23 = (undefined1 (*) [64])(*pauVar23 + local_e30 * 4);
                          }
                          lVar31 = lVar31 + 1;
                          pauVar48 = pauVar48 + 8;
                        } while (lVar31 != 6);
                        pvVar26 = (void *)((long)local_e50 + 1U);
                        lVar31 = local_e48 + 0x40;
                      } while ((void *)((long)local_e50 + 1U) != local_d50);
                    }
                    uVar32 = local_d28 + 0x10;
                    local_d68 = (ulong)(uint)((int)local_d68 + local_d3c);
                  } while (local_d28 + 0x1f < local_c90);
                }
                if ((int)((uint)uVar32 | 7) < (int)uVar49) {
                  lVar18 = (long)(int)(uVar50 * 2);
                  lVar13 = (long)(int)(uVar50 * 3);
                  local_e30 = (long)(int)(uVar50 * 4);
                  lVar14 = (long)(int)(uVar50 * 5);
                  lVar15 = (long)(int)(uVar50 * 6);
                  lVar16 = (long)(int)(uVar50 * 7);
                  iVar34 = (uint)uVar32 * iVar47 * 0x40;
                  local_e58 = CONCAT44(local_e58._4_4_,iVar47 * 0x200);
                  local_e48 = (long)local_ed8 * 4;
                  local_e60 = (long)(iVar47 * 8) * 4;
                  local_e68 = (long)(iVar47 * 0x10) * 4;
                  local_e70 = (long)(iVar47 * 0x18) * 4;
                  local_e78 = (void *)((long)(iVar47 << 5) * 4);
                  local_d48 = (long)(iVar47 * 0x28) * 4;
                  local_d50 = (void *)((long)(iVar47 * 0x30) * 4);
                  local_d58 = (long)(iVar47 * 0x38) * 4;
                  local_d60 = (void *)((long)local_f18 + local_ee8 * 4);
                  lVar17 = (long)(int)uVar50;
                  local_e50 = (void *)(local_f30 & 0xffffffff);
                  local_ef0 = uVar32 & 0xffffffff;
                  do {
                    if (local_f18 == (void *)0x0) {
                      auVar65 = ZEXT1632(ZEXT816(0) << 0x40);
                    }
                    else {
                      auVar65 = *(undefined1 (*) [32])((long)local_d60 + local_ef0 * 4);
                    }
                    if (0 < iVar47) {
                      lVar20 = (long)iVar34;
                      local_ef8 = (_func_int ***)(lVar20 * 4);
                      local_f00 = (void *)(local_e60 + lVar20 * 4);
                      local_f10 = (ulong)((iVar41 + (int)local_ef0) / iVar33);
                      pvVar26 = (void *)0x0;
                      lVar19 = 0;
                      do {
                        local_f20 = lVar19;
                        local_f28 = pvVar26;
                        iVar12 = iVar28 + (int)local_f28;
                        lVar19 = (long)local_e00.data + local_f20;
                        lVar21 = -0x100;
                        do {
                          auVar5 = *(undefined1 (*) [32])(lVar19 + (long)local_f00);
                          auVar70 = *(undefined1 (*) [32])(lVar19 + local_e68 + lVar20 * 4);
                          auVar95 = *(undefined1 (*) [32])(lVar19 + local_e70 + lVar20 * 4);
                          auVar66 = *(undefined1 (*) [32])((long)local_e78 + lVar19 + lVar20 * 4);
                          auVar67 = *(undefined1 (*) [32])(lVar19 + local_d48 + lVar20 * 4);
                          auVar68 = *(undefined1 (*) [32])((long)local_d50 + lVar19 + lVar20 * 4);
                          auVar118._0_4_ = auVar70._0_4_ + auVar5._0_4_;
                          auVar118._4_4_ = auVar70._4_4_ + auVar5._4_4_;
                          auVar118._8_4_ = auVar70._8_4_ + auVar5._8_4_;
                          auVar118._12_4_ = auVar70._12_4_ + auVar5._12_4_;
                          auVar118._16_4_ = auVar70._16_4_ + auVar5._16_4_;
                          auVar118._20_4_ = auVar70._20_4_ + auVar5._20_4_;
                          auVar118._24_4_ = auVar70._24_4_ + auVar5._24_4_;
                          auVar118._28_4_ = auVar70._28_4_ + auVar5._28_4_;
                          auVar5 = vsubps_avx(auVar5,auVar70);
                          auVar69._0_4_ = auVar66._0_4_ + auVar95._0_4_;
                          auVar69._4_4_ = auVar66._4_4_ + auVar95._4_4_;
                          auVar69._8_4_ = auVar66._8_4_ + auVar95._8_4_;
                          auVar69._12_4_ = auVar66._12_4_ + auVar95._12_4_;
                          auVar69._16_4_ = auVar66._16_4_ + auVar95._16_4_;
                          auVar69._20_4_ = auVar66._20_4_ + auVar95._20_4_;
                          auVar69._24_4_ = auVar66._24_4_ + auVar95._24_4_;
                          auVar69._28_4_ = auVar66._28_4_ + auVar95._28_4_;
                          auVar70 = vsubps_avx(auVar95,auVar66);
                          auVar105._0_4_ = auVar68._0_4_ + auVar67._0_4_;
                          auVar105._4_4_ = auVar68._4_4_ + auVar67._4_4_;
                          auVar105._8_4_ = auVar68._8_4_ + auVar67._8_4_;
                          auVar105._12_4_ = auVar68._12_4_ + auVar67._12_4_;
                          auVar105._16_4_ = auVar68._16_4_ + auVar67._16_4_;
                          auVar105._20_4_ = auVar68._20_4_ + auVar67._20_4_;
                          auVar105._24_4_ = auVar68._24_4_ + auVar67._24_4_;
                          auVar105._28_4_ = auVar68._28_4_ + auVar67._28_4_;
                          auVar95 = vsubps_avx(auVar67,auVar68);
                          pfVar39 = (float *)((long)local_ef8 + lVar19);
                          auVar130 = auVar131._0_32_;
                          auVar53 = vfmadd213ps_fma(auVar130,auVar105,auVar69);
                          auVar113._0_4_ = auVar53._0_4_ + auVar118._0_4_ + *pfVar39;
                          auVar113._4_4_ = auVar53._4_4_ + auVar118._4_4_ + pfVar39[1];
                          auVar113._8_4_ = auVar53._8_4_ + auVar118._8_4_ + pfVar39[2];
                          auVar113._12_4_ = auVar53._12_4_ + auVar118._12_4_ + pfVar39[3];
                          auVar113._16_4_ = auVar118._16_4_ + pfVar39[4] + 0.0;
                          auVar113._20_4_ = auVar118._20_4_ + pfVar39[5] + 0.0;
                          auVar113._24_4_ = auVar118._24_4_ + pfVar39[6] + 0.0;
                          auVar113._28_4_ = auVar118._28_4_ + pfVar39[7] + 0.0;
                          auVar132 = auVar133._0_32_;
                          auVar53 = vfmadd213ps_fma(auVar132,auVar70,auVar5);
                          auVar134 = auVar135._0_32_;
                          auVar66 = vfmadd231ps_avx512vl(ZEXT1632(auVar53),auVar95,auVar134);
                          auVar136 = auVar137._0_32_;
                          auVar53 = vfmadd213ps_fma(auVar136,auVar69,auVar118);
                          auVar138 = auVar139._0_32_;
                          auVar67 = vfmadd231ps_avx512vl(ZEXT1632(auVar53),auVar105,auVar138);
                          auVar53 = vfmadd213ps_fma(auVar138,auVar70,auVar5);
                          auVar68 = vfmadd231ps_avx512vl(ZEXT1632(auVar53),auVar95,auVar136);
                          auVar69 = vfmadd213ps_avx512vl(auVar69,auVar134,auVar118);
                          auVar69 = vfmadd231ps_avx512vl(auVar69,auVar132,auVar105);
                          pfVar39 = (float *)(lVar19 + local_d58 + lVar20 * 4);
                          auVar70 = vfmadd213ps_avx512vl(auVar70,auVar130,auVar95);
                          auVar95._0_4_ = auVar5._0_4_ + *pfVar39 + auVar70._0_4_;
                          auVar95._4_4_ = auVar5._4_4_ + pfVar39[1] + auVar70._4_4_;
                          auVar95._8_4_ = auVar5._8_4_ + pfVar39[2] + auVar70._8_4_;
                          auVar95._12_4_ = auVar5._12_4_ + pfVar39[3] + auVar70._12_4_;
                          auVar95._16_4_ = auVar5._16_4_ + pfVar39[4] + auVar70._16_4_;
                          auVar95._20_4_ = auVar5._20_4_ + pfVar39[5] + auVar70._20_4_;
                          auVar95._24_4_ = auVar5._24_4_ + pfVar39[6] + auVar70._24_4_;
                          auVar95._28_4_ = auVar5._28_4_ + pfVar39[7] + auVar70._28_4_;
                          *(undefined1 (*) [32])((long)local_b80 + lVar21) = auVar113;
                          *(undefined1 (*) [32])(auStack_a80 + lVar21) = auVar66;
                          *(undefined1 (*) [32])(auStack_980 + lVar21) = auVar67;
                          *(undefined1 (*) [32])(auStack_880 + lVar21) = auVar68;
                          *(undefined1 (*) [32])(auStack_780 + lVar21) = auVar69;
                          *(undefined1 (*) [32])(auStack_680 + lVar21) = auVar95;
                          lVar19 = lVar19 + local_e48;
                          lVar21 = lVar21 + 0x20;
                        } while (lVar21 != 0);
                        iVar44 = iVar12 % (int)uVar46;
                        lVar21 = (long)((iVar12 / (int)uVar46) * 6);
                        pauVar24 = (undefined1 (*) [32])
                                   ((long)local_e88->data +
                                   (long)(iVar44 * 6 * iVar33) * 4 +
                                   (long)local_e88->w * local_e88->elemsize * lVar21 +
                                   local_e88->cstep * local_f10 * local_e88->elemsize);
                        iVar36 = iVar44 * 6 + 1;
                        iVar12 = iVar44 * 6 + 2;
                        iVar1 = iVar44 * 6 + 3;
                        iVar29 = iVar44 * 6 + 4;
                        iVar44 = iVar44 * 6 + 5;
                        pfVar39 = afStack_ba0;
                        lVar19 = 0;
                        do {
                          if (lVar19 < local_e40 - lVar21) {
                            auVar5 = *(undefined1 (*) [32])(pfVar39 + -0x30);
                            auVar70 = *(undefined1 (*) [32])(pfVar39 + -0x28);
                            auVar95 = *(undefined1 (*) [32])(pfVar39 + -0x20);
                            auVar66 = *(undefined1 (*) [32])(pfVar39 + -0x18);
                            auVar67 = *(undefined1 (*) [32])(pfVar39 + -0x10);
                            auVar68 = *(undefined1 (*) [32])(pfVar39 + -8);
                            auVar119._0_4_ = auVar70._0_4_ + auVar5._0_4_;
                            auVar119._4_4_ = auVar70._4_4_ + auVar5._4_4_;
                            auVar119._8_4_ = auVar70._8_4_ + auVar5._8_4_;
                            auVar119._12_4_ = auVar70._12_4_ + auVar5._12_4_;
                            auVar119._16_4_ = auVar70._16_4_ + auVar5._16_4_;
                            auVar119._20_4_ = auVar70._20_4_ + auVar5._20_4_;
                            auVar119._24_4_ = auVar70._24_4_ + auVar5._24_4_;
                            auVar119._28_4_ = auVar70._28_4_ + auVar5._28_4_;
                            auVar5 = vsubps_avx(auVar5,auVar70);
                            auVar99._0_4_ = auVar66._0_4_ + auVar95._0_4_;
                            auVar99._4_4_ = auVar66._4_4_ + auVar95._4_4_;
                            auVar99._8_4_ = auVar66._8_4_ + auVar95._8_4_;
                            auVar99._12_4_ = auVar66._12_4_ + auVar95._12_4_;
                            auVar99._16_4_ = auVar66._16_4_ + auVar95._16_4_;
                            auVar99._20_4_ = auVar66._20_4_ + auVar95._20_4_;
                            auVar99._24_4_ = auVar66._24_4_ + auVar95._24_4_;
                            auVar99._28_4_ = auVar66._28_4_ + auVar95._28_4_;
                            auVar70 = vsubps_avx(auVar95,auVar66);
                            auVar123._0_4_ = auVar68._0_4_ + auVar67._0_4_;
                            auVar123._4_4_ = auVar68._4_4_ + auVar67._4_4_;
                            auVar123._8_4_ = auVar68._8_4_ + auVar67._8_4_;
                            auVar123._12_4_ = auVar68._12_4_ + auVar67._12_4_;
                            auVar123._16_4_ = auVar68._16_4_ + auVar67._16_4_;
                            auVar123._20_4_ = auVar68._20_4_ + auVar67._20_4_;
                            auVar123._24_4_ = auVar68._24_4_ + auVar67._24_4_;
                            auVar123._28_4_ = auVar68._28_4_ + auVar67._28_4_;
                            auVar95 = vsubps_avx(auVar67,auVar68);
                            fVar86 = auVar65._0_4_;
                            fVar88 = auVar65._4_4_;
                            fVar89 = auVar65._8_4_;
                            fVar90 = auVar65._12_4_;
                            fVar91 = auVar65._16_4_;
                            fVar92 = auVar65._20_4_;
                            fVar93 = auVar65._24_4_;
                            fVar94 = auVar65._28_4_;
                            auVar53 = vfmadd213ps_fma(auVar130,auVar123,auVar99);
                            auVar63._0_4_ = fVar86 + pfVar39[-0x38] + auVar119._0_4_ + auVar53._0_4_
                            ;
                            auVar63._4_4_ = fVar88 + pfVar39[-0x37] + auVar119._4_4_ + auVar53._4_4_
                            ;
                            auVar63._8_4_ = fVar89 + pfVar39[-0x36] + auVar119._8_4_ + auVar53._8_4_
                            ;
                            auVar63._12_4_ =
                                 fVar90 + pfVar39[-0x35] + auVar119._12_4_ + auVar53._12_4_;
                            auVar114._16_4_ = fVar91 + pfVar39[-0x34] + auVar119._16_4_ + 0.0;
                            auVar114._0_16_ = auVar63;
                            auVar114._20_4_ = fVar92 + pfVar39[-0x33] + auVar119._20_4_ + 0.0;
                            auVar114._24_4_ = fVar93 + pfVar39[-0x32] + auVar119._24_4_ + 0.0;
                            auVar114._28_4_ = fVar94 + pfVar39[-0x31] + auVar119._28_4_ + 0.0;
                            auVar53 = vfmadd213ps_fma(auVar132,auVar70,auVar5);
                            auVar66 = vfmadd231ps_avx512vl(ZEXT1632(auVar53),auVar95,auVar134);
                            auVar61._0_4_ = auVar66._0_4_ + fVar86;
                            auVar61._4_4_ = auVar66._4_4_ + fVar88;
                            auVar61._8_4_ = auVar66._8_4_ + fVar89;
                            auVar61._12_4_ = auVar66._12_4_ + fVar90;
                            auVar109._16_4_ = auVar66._16_4_ + fVar91;
                            auVar109._0_16_ = auVar61;
                            auVar109._20_4_ = auVar66._20_4_ + fVar92;
                            auVar109._24_4_ = auVar66._24_4_ + fVar93;
                            auVar109._28_4_ = auVar66._28_4_ + fVar94;
                            auVar53 = vfmadd213ps_fma(auVar136,auVar99,auVar119);
                            auVar66 = vfmadd231ps_avx512vl(ZEXT1632(auVar53),auVar123,auVar138);
                            auVar59._0_4_ = auVar66._0_4_ + fVar86;
                            auVar59._4_4_ = auVar66._4_4_ + fVar88;
                            auVar59._8_4_ = auVar66._8_4_ + fVar89;
                            auVar59._12_4_ = auVar66._12_4_ + fVar90;
                            auVar106._16_4_ = auVar66._16_4_ + fVar91;
                            auVar106._0_16_ = auVar59;
                            auVar106._20_4_ = auVar66._20_4_ + fVar92;
                            auVar106._24_4_ = auVar66._24_4_ + fVar93;
                            auVar106._28_4_ = auVar66._28_4_ + fVar94;
                            auVar53 = vfmadd213ps_fma(auVar138,auVar70,auVar5);
                            auVar66 = vfmadd231ps_avx512vl(ZEXT1632(auVar53),auVar95,auVar136);
                            auVar55._0_4_ = auVar66._0_4_ + fVar86;
                            auVar55._4_4_ = auVar66._4_4_ + fVar88;
                            auVar55._8_4_ = auVar66._8_4_ + fVar89;
                            auVar55._12_4_ = auVar66._12_4_ + fVar90;
                            auVar68._16_4_ = auVar66._16_4_ + fVar91;
                            auVar68._0_16_ = auVar55;
                            auVar68._20_4_ = auVar66._20_4_ + fVar92;
                            auVar68._24_4_ = auVar66._24_4_ + fVar93;
                            auVar68._28_4_ = auVar66._28_4_ + fVar94;
                            auVar66 = vfmadd213ps_avx512vl(auVar99,auVar134,auVar119);
                            auVar66 = vfmadd231ps_avx512vl(auVar66,auVar132,auVar123);
                            auVar57._0_4_ = auVar66._0_4_ + fVar86;
                            auVar57._4_4_ = auVar66._4_4_ + fVar88;
                            auVar57._8_4_ = auVar66._8_4_ + fVar89;
                            auVar57._12_4_ = auVar66._12_4_ + fVar90;
                            auVar67._16_4_ = auVar66._16_4_ + fVar91;
                            auVar67._0_16_ = auVar57;
                            auVar67._20_4_ = auVar66._20_4_ + fVar92;
                            auVar67._24_4_ = auVar66._24_4_ + fVar93;
                            auVar67._28_4_ = auVar66._28_4_ + fVar94;
                            auVar70 = vfmadd213ps_avx512vl(auVar70,auVar130,auVar95);
                            auVar53._0_4_ = auVar70._0_4_ + auVar5._0_4_ + fVar86 + *pfVar39;
                            auVar53._4_4_ = auVar70._4_4_ + auVar5._4_4_ + fVar88 + pfVar39[1];
                            auVar53._8_4_ = auVar70._8_4_ + auVar5._8_4_ + fVar89 + pfVar39[2];
                            auVar53._12_4_ = auVar70._12_4_ + auVar5._12_4_ + fVar90 + pfVar39[3];
                            auVar66._16_4_ = auVar70._16_4_ + auVar5._16_4_ + fVar91 + pfVar39[4];
                            auVar66._0_16_ = auVar53;
                            auVar66._20_4_ = auVar70._20_4_ + auVar5._20_4_ + fVar92 + pfVar39[5];
                            auVar66._24_4_ = auVar70._24_4_ + auVar5._24_4_ + fVar93 + pfVar39[6];
                            auVar66._28_4_ = auVar70._28_4_ + auVar5._28_4_ + fVar94 + pfVar39[7];
                            auVar64 = auVar114._16_16_;
                            auVar62 = auVar109._16_16_;
                            auVar60 = auVar106._16_16_;
                            auVar54 = auVar68._16_16_;
                            auVar56 = auVar67._16_16_;
                            auVar58 = auVar66._16_16_;
                            if (iVar33 == 1) {
                              *(float *)*pauVar24 = auVar63._0_4_;
                              uVar6 = vextractps_avx(auVar63,1);
                              *(undefined4 *)(*pauVar24 + lVar17 * 4) = uVar6;
                              uVar6 = vextractps_avx(auVar63,2);
                              *(undefined4 *)(*pauVar24 + lVar18 * 4) = uVar6;
                              uVar6 = vextractps_avx(auVar63,3);
                              *(undefined4 *)(*pauVar24 + lVar13 * 4) = uVar6;
                              *(float *)(*pauVar24 + local_e30 * 4) = auVar114._16_4_;
                              uVar6 = vextractps_avx(auVar64,1);
                              *(undefined4 *)(*pauVar24 + lVar14 * 4) = uVar6;
                              uVar6 = vextractps_avx(auVar64,2);
                              *(undefined4 *)(*pauVar24 + lVar15 * 4) = uVar6;
                              uVar6 = vextractps_avx(auVar64,3);
                              *(undefined4 *)(*pauVar24 + lVar16 * 4) = uVar6;
                              if (iVar36 < iVar11) {
                                *(float *)(*pauVar24 + 4) = auVar61._0_4_;
                                uVar6 = vextractps_avx(auVar61,1);
                                *(undefined4 *)(*pauVar24 + lVar17 * 4 + 4) = uVar6;
                                uVar6 = vextractps_avx(auVar61,2);
                                *(undefined4 *)(*pauVar24 + lVar18 * 4 + 4) = uVar6;
                                uVar6 = vextractps_avx(auVar61,3);
                                *(undefined4 *)(*pauVar24 + lVar13 * 4 + 4) = uVar6;
                                *(float *)(*pauVar24 + local_e30 * 4 + 4) = auVar109._16_4_;
                                uVar6 = vextractps_avx(auVar62,1);
                                *(undefined4 *)(*pauVar24 + lVar14 * 4 + 4) = uVar6;
                                uVar6 = vextractps_avx(auVar62,2);
                                *(undefined4 *)(*pauVar24 + lVar15 * 4 + 4) = uVar6;
                                uVar6 = vextractps_avx(auVar62,3);
                                *(undefined4 *)(*pauVar24 + lVar16 * 4 + 4) = uVar6;
                              }
                              if (iVar12 < iVar11) {
                                *(float *)(*pauVar24 + 8) = auVar59._0_4_;
                                uVar6 = vextractps_avx(auVar59,1);
                                *(undefined4 *)(*pauVar24 + lVar17 * 4 + 8) = uVar6;
                                uVar6 = vextractps_avx(auVar59,2);
                                *(undefined4 *)(*pauVar24 + lVar18 * 4 + 8) = uVar6;
                                uVar6 = vextractps_avx(auVar59,3);
                                *(undefined4 *)(*pauVar24 + lVar13 * 4 + 8) = uVar6;
                                *(float *)(*pauVar24 + local_e30 * 4 + 8) = auVar106._16_4_;
                                uVar6 = vextractps_avx(auVar60,1);
                                *(undefined4 *)(*pauVar24 + lVar14 * 4 + 8) = uVar6;
                                uVar6 = vextractps_avx(auVar60,2);
                                *(undefined4 *)(*pauVar24 + lVar15 * 4 + 8) = uVar6;
                                uVar6 = vextractps_avx(auVar60,3);
                                *(undefined4 *)(*pauVar24 + lVar16 * 4 + 8) = uVar6;
                              }
                              if (iVar1 < iVar11) {
                                *(float *)(*pauVar24 + 0xc) = auVar55._0_4_;
                                uVar6 = vextractps_avx(auVar55,1);
                                *(undefined4 *)(*pauVar24 + lVar17 * 4 + 0xc) = uVar6;
                                uVar6 = vextractps_avx(auVar55,2);
                                *(undefined4 *)(*pauVar24 + lVar18 * 4 + 0xc) = uVar6;
                                uVar6 = vextractps_avx(auVar55,3);
                                *(undefined4 *)(*pauVar24 + lVar13 * 4 + 0xc) = uVar6;
                                *(float *)(*pauVar24 + local_e30 * 4 + 0xc) = auVar68._16_4_;
                                uVar6 = vextractps_avx(auVar54,1);
                                *(undefined4 *)(*pauVar24 + lVar14 * 4 + 0xc) = uVar6;
                                uVar6 = vextractps_avx(auVar54,2);
                                *(undefined4 *)(*pauVar24 + lVar15 * 4 + 0xc) = uVar6;
                                uVar6 = vextractps_avx(auVar54,3);
                                *(undefined4 *)(*pauVar24 + lVar16 * 4 + 0xc) = uVar6;
                              }
                              if (iVar29 < iVar11) {
                                *(float *)(*pauVar24 + 0x10) = auVar57._0_4_;
                                uVar6 = vextractps_avx(auVar57,1);
                                *(undefined4 *)(*pauVar24 + lVar17 * 4 + 0x10) = uVar6;
                                uVar6 = vextractps_avx(auVar57,2);
                                *(undefined4 *)(*pauVar24 + lVar18 * 4 + 0x10) = uVar6;
                                uVar6 = vextractps_avx(auVar57,3);
                                *(undefined4 *)(*pauVar24 + lVar13 * 4 + 0x10) = uVar6;
                                *(float *)(*pauVar24 + local_e30 * 4 + 0x10) = auVar67._16_4_;
                                uVar6 = vextractps_avx(auVar56,1);
                                *(undefined4 *)(*pauVar24 + lVar14 * 4 + 0x10) = uVar6;
                                uVar6 = vextractps_avx(auVar56,2);
                                *(undefined4 *)(*pauVar24 + lVar15 * 4 + 0x10) = uVar6;
                                uVar6 = vextractps_avx(auVar56,3);
                                *(undefined4 *)(*pauVar24 + lVar16 * 4 + 0x10) = uVar6;
                              }
                              if (iVar44 < iVar11) {
                                *(float *)(*pauVar24 + 0x14) = auVar53._0_4_;
                                uVar6 = vextractps_avx(auVar53,1);
                                *(undefined4 *)(*pauVar24 + lVar17 * 4 + 0x14) = uVar6;
                                uVar6 = vextractps_avx(auVar53,2);
                                *(undefined4 *)(*pauVar24 + lVar18 * 4 + 0x14) = uVar6;
                                uVar6 = vextractps_avx(auVar53,3);
                                *(undefined4 *)(*pauVar24 + lVar13 * 4 + 0x14) = uVar6;
                                *(float *)(*pauVar24 + local_e30 * 4 + 0x14) = auVar66._16_4_;
                                uVar6 = vextractps_avx(auVar58,1);
                                *(undefined4 *)(*pauVar24 + lVar14 * 4 + 0x14) = uVar6;
                                uVar6 = vextractps_avx(auVar58,2);
                                *(undefined4 *)(*pauVar24 + lVar15 * 4 + 0x14) = uVar6;
                                uVar6 = vextractps_avx(auVar58,3);
                                *(undefined4 *)(*pauVar24 + lVar16 * 4 + 0x14) = uVar6;
                              }
                            }
                            else if (iVar33 == 4) {
                              *(undefined1 (*) [16])*pauVar24 = auVar63;
                              *(undefined1 (*) [16])(*pauVar24 + lVar17 * 4) = auVar64;
                              if (iVar36 < iVar11) {
                                *(undefined1 (*) [16])(*pauVar24 + 0x10) = auVar61;
                                *(undefined1 (*) [16])(*pauVar24 + lVar17 * 4 + 0x10) = auVar62;
                              }
                              if (iVar12 < iVar11) {
                                *(undefined1 (*) [16])pauVar24[1] = auVar59;
                                *(undefined1 (*) [16])(pauVar24[1] + lVar17 * 4) = auVar60;
                              }
                              if (iVar1 < iVar11) {
                                *(undefined1 (*) [16])(pauVar24[1] + 0x10) = auVar55;
                                *(undefined1 (*) [16])(pauVar24[1] + lVar17 * 4 + 0x10) = auVar54;
                              }
                              if (iVar29 < iVar11) {
                                *(undefined1 (*) [16])pauVar24[2] = auVar57;
                                *(undefined1 (*) [16])(pauVar24[2] + lVar17 * 4) = auVar56;
                              }
                              if (iVar44 < iVar11) {
                                *(undefined1 (*) [16])(pauVar24[2] + 0x10) = auVar53;
                                *(undefined1 (*) [16])(pauVar24[2] + lVar17 * 4 + 0x10) = auVar58;
                              }
                            }
                            else if (iVar33 == 8) {
                              *pauVar24 = auVar114;
                              if (iVar36 < iVar11) {
                                pauVar24[1] = auVar109;
                              }
                              if (iVar12 < iVar11) {
                                pauVar24[2] = auVar106;
                              }
                              if (iVar1 < iVar11) {
                                pauVar24[3] = auVar68;
                              }
                              if (iVar29 < iVar11) {
                                pauVar24[4] = auVar67;
                              }
                              if (iVar44 < iVar11) {
                                pauVar24[5] = auVar66;
                              }
                            }
                            pauVar24 = (undefined1 (*) [32])
                                       (*pauVar24 + (long)(iVar33 * iVar11) * 4);
                          }
                          lVar19 = lVar19 + 1;
                          pfVar39 = pfVar39 + 0x40;
                        } while (lVar19 != 6);
                        pvVar26 = (void *)((long)local_f28 + 1U);
                        lVar19 = local_f20 + 0x20;
                      } while ((void *)((long)local_f28 + 1U) != local_e50);
                    }
                    uVar32 = local_ef0 + 8;
                    lVar19 = local_ef0 + 0xf;
                    iVar34 = iVar34 + iVar47 * 0x200;
                    local_ef0 = uVar32;
                  } while (lVar19 < local_e08);
                  uVar32 = uVar32 & 0xffffffff;
                }
                uVar42 = (uint)uVar32;
                auVar53 = auVar140._0_16_;
                auVar58 = auVar141._0_16_;
                if ((int)(uVar42 | 3) < (int)uVar49) {
                  local_ef8 = (_func_int ***)(long)(int)(uVar50 * 2);
                  lVar13 = (long)(int)(uVar50 * 3);
                  iVar34 = uVar42 * iVar47 * 0x40;
                  local_e30 = CONCAT44(local_e30._4_4_,iVar47 * 0x100);
                  local_f28 = (void *)((long)(iVar47 << 5) * 4);
                  local_e48 = (long)(iVar47 * 4) * 4;
                  local_e50 = (void *)((long)(iVar47 * 8) * 4);
                  local_ef0 = (long)(iVar47 * 0xc) * 4;
                  local_e58 = (long)(iVar47 << 4) * 4;
                  local_e60 = (long)(iVar47 * 0x14) * 4;
                  local_e68 = (long)(iVar47 * 0x18) * 4;
                  local_e70 = (long)(iVar47 * 0x1c) * 4;
                  local_e78 = (void *)((long)local_f18 + local_ee8 * 4);
                  lVar14 = (long)(int)uVar50;
                  local_f00 = (void *)(local_f30 & 0xffffffff);
                  local_f10 = uVar32 & 0xffffffff;
                  do {
                    if (local_f18 == (void *)0x0) {
                      auVar57 = ZEXT816(0) << 0x40;
                    }
                    else {
                      auVar57 = *(undefined1 (*) [16])((long)local_e78 + local_f10 * 4);
                    }
                    if (0 < iVar47) {
                      lVar15 = (long)iVar34;
                      local_f20 = (long)((iVar41 + (int)local_f10) / iVar33);
                      lVar16 = 0;
                      pvVar26 = (void *)0x0;
                      do {
                        iVar12 = (int)pvVar26 + iVar28;
                        lVar17 = (long)local_e00.data + lVar16;
                        lVar18 = -0x80;
                        do {
                          auVar56 = *(undefined1 (*) [16])(lVar17 + local_e48 + lVar15 * 4);
                          auVar55 = *(undefined1 (*) [16])((long)local_e50 + lVar17 + lVar15 * 4);
                          auVar54 = *(undefined1 (*) [16])(lVar17 + local_ef0 + lVar15 * 4);
                          auVar59 = *(undefined1 (*) [16])(lVar17 + local_e58 + lVar15 * 4);
                          auVar60 = *(undefined1 (*) [16])(lVar17 + local_e60 + lVar15 * 4);
                          auVar61 = *(undefined1 (*) [16])(lVar17 + local_e68 + lVar15 * 4);
                          auVar115._0_4_ = auVar55._0_4_ + auVar56._0_4_;
                          auVar115._4_4_ = auVar55._4_4_ + auVar56._4_4_;
                          auVar115._8_4_ = auVar55._8_4_ + auVar56._8_4_;
                          auVar115._12_4_ = auVar55._12_4_ + auVar56._12_4_;
                          auVar56 = vsubps_avx(auVar56,auVar55);
                          auVar64._0_4_ = auVar59._0_4_ + auVar54._0_4_;
                          auVar64._4_4_ = auVar59._4_4_ + auVar54._4_4_;
                          auVar64._8_4_ = auVar59._8_4_ + auVar54._8_4_;
                          auVar64._12_4_ = auVar59._12_4_ + auVar54._12_4_;
                          auVar55 = vsubps_avx(auVar54,auVar59);
                          auVar102._0_4_ = auVar61._0_4_ + auVar60._0_4_;
                          auVar102._4_4_ = auVar61._4_4_ + auVar60._4_4_;
                          auVar102._8_4_ = auVar61._8_4_ + auVar60._8_4_;
                          auVar102._12_4_ = auVar61._12_4_ + auVar60._12_4_;
                          auVar54 = vsubps_avx(auVar60,auVar61);
                          pfVar39 = (float *)(lVar17 + lVar15 * 4);
                          auVar59 = vfmadd213ps_fma(auVar53,auVar102,auVar64);
                          auVar110._0_4_ = auVar59._0_4_ + auVar115._0_4_ + *pfVar39;
                          auVar110._4_4_ = auVar59._4_4_ + auVar115._4_4_ + pfVar39[1];
                          auVar110._8_4_ = auVar59._8_4_ + auVar115._8_4_ + pfVar39[2];
                          auVar110._12_4_ = auVar59._12_4_ + auVar115._12_4_ + pfVar39[3];
                          auVar59 = vfmadd213ps_fma(auVar58,auVar55,auVar56);
                          auVar63 = auVar127._0_16_;
                          auVar60 = vfmadd231ps_fma(auVar59,auVar54,auVar63);
                          auVar97 = auVar128._0_16_;
                          auVar59 = vfmadd213ps_fma(auVar97,auVar64,auVar115);
                          auVar98 = auVar129._0_16_;
                          auVar61 = vfmadd231ps_fma(auVar59,auVar102,auVar98);
                          auVar59 = vfmadd213ps_fma(auVar98,auVar55,auVar56);
                          auVar62 = vfmadd231ps_fma(auVar59,auVar54,auVar97);
                          auVar59 = vfmadd213ps_fma(auVar64,auVar63,auVar115);
                          auVar59 = vfmadd231ps_avx512vl(auVar59,auVar58,auVar102);
                          pfVar39 = (float *)(lVar17 + local_e70 + lVar15 * 4);
                          auVar55 = vfmadd213ps_avx512vl(auVar55,auVar53,auVar54);
                          auVar54._0_4_ = auVar56._0_4_ + *pfVar39 + auVar55._0_4_;
                          auVar54._4_4_ = auVar56._4_4_ + pfVar39[1] + auVar55._4_4_;
                          auVar54._8_4_ = auVar56._8_4_ + pfVar39[2] + auVar55._8_4_;
                          auVar54._12_4_ = auVar56._12_4_ + pfVar39[3] + auVar55._12_4_;
                          *(undefined1 (*) [16])((long)local_c00 + lVar18) = auVar110;
                          *(undefined1 (*) [16])((long)local_b80 + lVar18) = auVar60;
                          *(undefined1 (*) [16])((long)local_b00 + lVar18) = auVar61;
                          *(undefined1 (*) [16])(auStack_a80 + lVar18) = auVar62;
                          *(undefined1 (*) [16])(auStack_a00 + lVar18) = auVar59;
                          *(undefined1 (*) [16])(auStack_980 + lVar18) = auVar54;
                          lVar17 = lVar17 + (long)local_f28;
                          lVar18 = lVar18 + 0x10;
                        } while (lVar18 != 0);
                        iVar44 = iVar12 % (int)uVar46;
                        lVar17 = (long)((iVar12 / (int)uVar46) * 6);
                        pauVar25 = (undefined1 (*) [16])
                                   ((long)local_e88->data +
                                   (long)(iVar44 * 6 * iVar33) * 4 +
                                   (long)local_e88->w * local_e88->elemsize * lVar17 +
                                   local_e88->cstep * local_f20 * local_e88->elemsize);
                        iVar36 = iVar44 * 6 + 1;
                        iVar12 = iVar44 * 6 + 2;
                        iVar1 = iVar44 * 6 + 3;
                        iVar29 = iVar44 * 6 + 4;
                        iVar44 = iVar44 * 6 + 5;
                        pfVar39 = afStack_c20 + 4;
                        lVar18 = 0;
                        do {
                          if (lVar18 < local_e40 - lVar17) {
                            auVar56 = *(undefined1 (*) [16])(pfVar39 + -0x18);
                            auVar55 = *(undefined1 (*) [16])(pfVar39 + -0x14);
                            auVar54 = *(undefined1 (*) [16])(pfVar39 + -0x10);
                            auVar59 = *(undefined1 (*) [16])(pfVar39 + -0xc);
                            auVar60 = *(undefined1 (*) [16])(pfVar39 + -8);
                            auVar61 = *(undefined1 (*) [16])(pfVar39 + -4);
                            auVar116._0_4_ = auVar55._0_4_ + auVar56._0_4_;
                            auVar116._4_4_ = auVar55._4_4_ + auVar56._4_4_;
                            auVar116._8_4_ = auVar55._8_4_ + auVar56._8_4_;
                            auVar116._12_4_ = auVar55._12_4_ + auVar56._12_4_;
                            auVar56 = vsubps_avx(auVar56,auVar55);
                            auVar62._0_4_ = auVar59._0_4_ + auVar54._0_4_;
                            auVar62._4_4_ = auVar59._4_4_ + auVar54._4_4_;
                            auVar62._8_4_ = auVar59._8_4_ + auVar54._8_4_;
                            auVar62._12_4_ = auVar59._12_4_ + auVar54._12_4_;
                            auVar55 = vsubps_avx(auVar54,auVar59);
                            auVar121._0_4_ = auVar61._0_4_ + auVar60._0_4_;
                            auVar121._4_4_ = auVar61._4_4_ + auVar60._4_4_;
                            auVar121._8_4_ = auVar61._8_4_ + auVar60._8_4_;
                            auVar121._12_4_ = auVar61._12_4_ + auVar60._12_4_;
                            auVar54 = vsubps_avx(auVar60,auVar61);
                            fVar86 = auVar57._0_4_;
                            fVar88 = auVar57._4_4_;
                            fVar89 = auVar57._8_4_;
                            fVar90 = auVar57._12_4_;
                            auVar59 = vfmadd213ps_fma(auVar53,auVar121,auVar62);
                            auVar111._0_4_ =
                                 fVar86 + pfVar39[-0x1c] + auVar116._0_4_ + auVar59._0_4_;
                            auVar111._4_4_ =
                                 fVar88 + pfVar39[-0x1b] + auVar116._4_4_ + auVar59._4_4_;
                            auVar111._8_4_ =
                                 fVar89 + pfVar39[-0x1a] + auVar116._8_4_ + auVar59._8_4_;
                            auVar111._12_4_ =
                                 fVar90 + pfVar39[-0x19] + auVar116._12_4_ + auVar59._12_4_;
                            auVar59 = vfmadd213ps_fma(auVar58,auVar55,auVar56);
                            auVar59 = vfmadd231ps_fma(auVar59,auVar54,auVar63);
                            auVar107._0_4_ = auVar59._0_4_ + fVar86;
                            auVar107._4_4_ = auVar59._4_4_ + fVar88;
                            auVar107._8_4_ = auVar59._8_4_ + fVar89;
                            auVar107._12_4_ = auVar59._12_4_ + fVar90;
                            auVar59 = vfmadd213ps_fma(auVar97,auVar62,auVar116);
                            auVar59 = vfmadd231ps_fma(auVar59,auVar121,auVar98);
                            auVar103._0_4_ = auVar59._0_4_ + fVar86;
                            auVar103._4_4_ = auVar59._4_4_ + fVar88;
                            auVar103._8_4_ = auVar59._8_4_ + fVar89;
                            auVar103._12_4_ = auVar59._12_4_ + fVar90;
                            auVar59 = vfmadd213ps_fma(auVar98,auVar55,auVar56);
                            auVar59 = vfmadd231ps_fma(auVar59,auVar54,auVar97);
                            auVar100._0_4_ = auVar59._0_4_ + fVar86;
                            auVar100._4_4_ = auVar59._4_4_ + fVar88;
                            auVar100._8_4_ = auVar59._8_4_ + fVar89;
                            auVar100._12_4_ = auVar59._12_4_ + fVar90;
                            auVar59 = vfmadd213ps_fma(auVar62,auVar63,auVar116);
                            auVar59 = vfmadd231ps_avx512vl(auVar59,auVar58,auVar121);
                            auVar96._0_4_ = auVar59._0_4_ + fVar86;
                            auVar96._4_4_ = auVar59._4_4_ + fVar88;
                            auVar96._8_4_ = auVar59._8_4_ + fVar89;
                            auVar96._12_4_ = auVar59._12_4_ + fVar90;
                            auVar55 = vfmadd213ps_avx512vl(auVar55,auVar53,auVar54);
                            auVar60._0_4_ = auVar55._0_4_ + auVar56._0_4_ + fVar86 + *pfVar39;
                            auVar60._4_4_ = auVar55._4_4_ + auVar56._4_4_ + fVar88 + pfVar39[1];
                            auVar60._8_4_ = auVar55._8_4_ + auVar56._8_4_ + fVar89 + pfVar39[2];
                            auVar60._12_4_ = auVar55._12_4_ + auVar56._12_4_ + fVar90 + pfVar39[3];
                            if (iVar33 == 1) {
                              *(float *)*pauVar25 = auVar111._0_4_;
                              uVar6 = vextractps_avx(auVar111,1);
                              *(undefined4 *)(*pauVar25 + lVar14 * 4) = uVar6;
                              uVar6 = vextractps_avx(auVar111,2);
                              *(undefined4 *)(*pauVar25 + (long)local_ef8 * 4) = uVar6;
                              uVar6 = vextractps_avx(auVar111,3);
                              *(undefined4 *)(*pauVar25 + lVar13 * 4) = uVar6;
                              if (iVar36 < iVar11) {
                                *(float *)(*pauVar25 + 4) = auVar107._0_4_;
                                uVar6 = vextractps_avx(auVar107,1);
                                *(undefined4 *)(*pauVar25 + lVar14 * 4 + 4) = uVar6;
                                uVar6 = vextractps_avx(auVar107,2);
                                *(undefined4 *)(*pauVar25 + (long)local_ef8 * 4 + 4) = uVar6;
                                uVar6 = vextractps_avx(auVar107,3);
                                *(undefined4 *)(*pauVar25 + lVar13 * 4 + 4) = uVar6;
                              }
                              if (iVar12 < iVar11) {
                                *(float *)(*pauVar25 + 8) = auVar103._0_4_;
                                uVar6 = vextractps_avx(auVar103,1);
                                *(undefined4 *)(*pauVar25 + lVar14 * 4 + 8) = uVar6;
                                uVar6 = vextractps_avx(auVar103,2);
                                *(undefined4 *)(*pauVar25 + (long)local_ef8 * 4 + 8) = uVar6;
                                uVar6 = vextractps_avx(auVar103,3);
                                *(undefined4 *)(*pauVar25 + lVar13 * 4 + 8) = uVar6;
                              }
                              if (iVar1 < iVar11) {
                                *(float *)(*pauVar25 + 0xc) = auVar100._0_4_;
                                uVar6 = vextractps_avx(auVar100,1);
                                *(undefined4 *)(*pauVar25 + lVar14 * 4 + 0xc) = uVar6;
                                uVar6 = vextractps_avx(auVar100,2);
                                *(undefined4 *)(*pauVar25 + (long)local_ef8 * 4 + 0xc) = uVar6;
                                uVar6 = vextractps_avx(auVar100,3);
                                *(undefined4 *)(*pauVar25 + lVar13 * 4 + 0xc) = uVar6;
                              }
                              if (iVar29 < iVar11) {
                                *(float *)pauVar25[1] = auVar96._0_4_;
                                uVar6 = vextractps_avx(auVar96,1);
                                *(undefined4 *)(pauVar25[1] + lVar14 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar96,2);
                                *(undefined4 *)(pauVar25[1] + (long)local_ef8 * 4) = uVar6;
                                uVar6 = vextractps_avx(auVar96,3);
                                *(undefined4 *)(pauVar25[1] + lVar13 * 4) = uVar6;
                              }
                              if (iVar44 < iVar11) {
                                *(float *)(pauVar25[1] + 4) = auVar60._0_4_;
                                uVar6 = vextractps_avx(auVar60,1);
                                *(undefined4 *)(pauVar25[1] + lVar14 * 4 + 4) = uVar6;
                                uVar6 = vextractps_avx(auVar60,2);
                                *(undefined4 *)(pauVar25[1] + (long)local_ef8 * 4 + 4) = uVar6;
                                uVar6 = vextractps_avx(auVar60,3);
                                *(undefined4 *)(pauVar25[1] + lVar13 * 4 + 4) = uVar6;
                              }
                            }
                            else if (iVar33 == 4) {
                              *pauVar25 = auVar111;
                              if (iVar36 < iVar11) {
                                pauVar25[1] = auVar107;
                              }
                              if (iVar12 < iVar11) {
                                pauVar25[2] = auVar103;
                              }
                              if (iVar1 < iVar11) {
                                pauVar25[3] = auVar100;
                              }
                              if (iVar29 < iVar11) {
                                pauVar25[4] = auVar96;
                              }
                              if (iVar44 < iVar11) {
                                pauVar25[5] = auVar60;
                              }
                            }
                            pauVar25 = (undefined1 (*) [16])
                                       (*pauVar25 + (long)(iVar33 * iVar11) * 4);
                          }
                          lVar18 = lVar18 + 1;
                          pfVar39 = pfVar39 + 0x20;
                        } while (lVar18 != 6);
                        pvVar26 = (void *)((long)pvVar26 + 1);
                        lVar16 = lVar16 + 0x10;
                      } while (pvVar26 != local_f00);
                    }
                    uVar32 = local_f10 + 4;
                    lVar15 = local_f10 + 7;
                    iVar34 = iVar34 + iVar47 * 0x100;
                    local_f10 = uVar32;
                  } while (lVar15 < local_e08);
                  uVar42 = (uint)uVar32;
                }
                if ((int)(uVar42 | 1) < (int)uVar49) {
                  iVar33 = local_e88->w;
                  sVar7 = local_e88->elemsize;
                  local_f28 = (void *)(local_e88->cstep * sVar7);
                  iVar41 = uVar42 * iVar47 * 0x40;
                  local_f20 = CONCAT44(local_f20._4_4_,iVar47 * 0x80);
                  local_ef8 = (_func_int ***)local_e00.data;
                  local_f00 = local_e88->data;
                  lVar13 = (long)(int)uVar42;
                  do {
                    auVar56 = ZEXT816(0) << 0x40;
                    auVar57 = ZEXT816(0) << 0x40;
                    if (local_f18 != (void *)0x0) {
                      auVar57 = ZEXT416(*(uint *)((long)local_f18 + lVar13 * 4 + local_ee8 * 4));
                      auVar56 = ZEXT416(*(uint *)((long)local_f18 + lVar13 * 4 + local_ee8 * 4 + 4))
                      ;
                    }
                    if (0 < iVar47) {
                      puVar37 = (undefined8 *)((long)local_e00.data + (long)iVar41 * 4);
                      uVar32 = 0;
                      do {
                        iVar34 = iVar28 + (int)uVar32;
                        lVar14 = -0x40;
                        puVar38 = puVar37;
                        do {
                          uVar2 = *(ulong *)((long)puVar38 + (long)(iVar47 * 2) * 4);
                          auVar97._8_8_ = 0;
                          auVar97._0_8_ = uVar2;
                          uVar3 = *(ulong *)((long)puVar38 + (long)(iVar47 * 4) * 4);
                          auVar101._8_8_ = 0;
                          auVar101._0_8_ = uVar3;
                          auVar104._0_4_ = (float)uVar3 + (float)uVar2;
                          auVar104._4_4_ = (float)(uVar3 >> 0x20) + (float)(uVar2 >> 0x20);
                          auVar104._8_8_ = 0;
                          uVar2 = *(ulong *)((long)puVar38 + (long)(iVar47 * 6) * 4);
                          auVar108._8_8_ = 0;
                          auVar108._0_8_ = uVar2;
                          uVar3 = *(ulong *)((long)puVar38 + (long)(iVar47 * 8) * 4);
                          auVar112._8_8_ = 0;
                          auVar112._0_8_ = uVar3;
                          auVar117._0_4_ = (float)uVar3 + (float)uVar2;
                          auVar117._4_4_ = (float)(uVar3 >> 0x20) + (float)(uVar2 >> 0x20);
                          auVar117._8_8_ = 0;
                          uVar2 = *(ulong *)((long)puVar38 + (long)(iVar47 * 10) * 4);
                          auVar120._8_8_ = 0;
                          auVar120._0_8_ = uVar2;
                          uVar3 = *(ulong *)((long)puVar38 + (long)(iVar47 * 0xc) * 4);
                          auVar122._8_8_ = 0;
                          auVar122._0_8_ = uVar3;
                          auVar124._0_4_ = (float)uVar3 + (float)uVar2;
                          auVar124._4_4_ = (float)(uVar3 >> 0x20) + (float)(uVar2 >> 0x20);
                          auVar124._8_8_ = 0;
                          auVar126._0_4_ = auVar117._0_4_ + auVar104._0_4_;
                          auVar126._4_4_ = auVar117._4_4_ + auVar104._4_4_;
                          auVar126._8_8_ = 0;
                          auVar55 = vfmadd231ps_avx512vl(auVar126,auVar124,auVar53);
                          auVar125._0_4_ = auVar55._0_4_ + (float)*puVar38;
                          auVar125._4_4_ = auVar55._4_4_ + (float)((ulong)*puVar38 >> 0x20);
                          auVar125._8_4_ = auVar55._8_4_ + 0.0;
                          auVar125._12_4_ = auVar55._12_4_ + 0.0;
                          uVar4 = vmovlps_avx(auVar125);
                          *(undefined8 *)((long)local_c40 + lVar14) = uVar4;
                          auVar55 = vsubps_avx(auVar97,auVar101);
                          auVar54 = vsubps_avx(auVar108,auVar112);
                          auVar59 = vsubps_avx(auVar120,auVar122);
                          auVar60 = vfmadd213ps_fma(auVar58,auVar54,auVar55);
                          auVar60 = vfmadd231ps_fma(auVar60,auVar59,auVar127._0_16_);
                          uVar4 = vmovlps_avx(auVar60);
                          *(undefined8 *)((long)local_c00 + lVar14) = uVar4;
                          auVar60 = vfmadd213ps_fma(auVar128._0_16_,auVar117,auVar104);
                          auVar60 = vfmadd231ps_fma(auVar60,auVar124,auVar129._0_16_);
                          uVar4 = vmovlps_avx(auVar60);
                          *(undefined8 *)((long)local_bc0 + lVar14) = uVar4;
                          auVar60 = vfmadd213ps_fma(auVar129._0_16_,auVar54,auVar55);
                          auVar60 = vfmadd231ps_fma(auVar60,auVar59,auVar128._0_16_);
                          uVar4 = vmovlps_avx(auVar60);
                          *(undefined8 *)((long)local_b80 + lVar14) = uVar4;
                          auVar60 = vfmadd213ps_fma(auVar117,auVar127._0_16_,auVar104);
                          auVar60 = vfmadd231ps_avx512vl(auVar60,auVar58,auVar124);
                          uVar4 = vmovlps_avx(auVar60);
                          *(undefined8 *)((long)local_b40 + lVar14) = uVar4;
                          uVar4 = *(undefined8 *)((long)puVar38 + (long)(iVar47 * 0xe) * 4);
                          auVar55 = vfmadd213ps_avx512vl(auVar54,auVar53,auVar55);
                          auVar98._0_4_ = auVar55._0_4_ + auVar59._0_4_ + (float)uVar4;
                          auVar98._4_4_ =
                               auVar55._4_4_ + auVar59._4_4_ + (float)((ulong)uVar4 >> 0x20);
                          auVar98._8_4_ = auVar55._8_4_ + auVar59._8_4_ + 0.0;
                          auVar98._12_4_ = auVar55._12_4_ + auVar59._12_4_ + 0.0;
                          uVar4 = vmovlps_avx(auVar98);
                          *(undefined8 *)((long)local_b00 + lVar14) = uVar4;
                          puVar38 = (undefined8 *)((long)puVar38 + (long)(iVar47 * 0x10) * 4);
                          lVar14 = lVar14 + 8;
                        } while (lVar14 != 0);
                        iVar12 = iVar34 % (int)uVar46;
                        lVar14 = (long)((iVar34 / (int)uVar46) * 6);
                        puVar27 = (undefined4 *)
                                  ((long)local_f00 +
                                  (long)(iVar12 * 6) * 4 +
                                  (long)iVar33 * sVar7 * lVar14 +
                                  (local_ee8 + lVar13) * (long)local_f28);
                        pfVar39 = &fStack_c44;
                        lVar15 = 0;
                        do {
                          if (lVar15 < local_e40 - lVar14) {
                            auVar55 = vsubss_avx512f(ZEXT416((uint)pfVar39[-0xd]),
                                                     ZEXT416((uint)pfVar39[-0xb]));
                            auVar54 = vsubss_avx512f(ZEXT416((uint)pfVar39[-0xc]),
                                                     ZEXT416((uint)pfVar39[-10]));
                            fVar89 = pfVar39[-7] + pfVar39[-9];
                            fVar90 = pfVar39[-6] + pfVar39[-8];
                            fVar94 = pfVar39[-9] - pfVar39[-7];
                            fVar8 = pfVar39[-8] - pfVar39[-6];
                            fVar91 = pfVar39[-3] + pfVar39[-5];
                            auVar59 = vaddss_avx512f(ZEXT416((uint)pfVar39[-2]),
                                                     ZEXT416((uint)pfVar39[-4]));
                            fVar9 = pfVar39[-5] - pfVar39[-3];
                            fVar92 = pfVar39[-0xb] + pfVar39[-0xd] + auVar57._0_4_;
                            auVar60 = vsubss_avx512f(ZEXT416((uint)pfVar39[-4]),
                                                     ZEXT416((uint)pfVar39[-2]));
                            auVar61 = vaddss_avx512f(ZEXT416((uint)(fVar92 + pfVar39[-0xf])),
                                                     ZEXT416((uint)fVar89));
                            auVar61 = vfmadd231ss_avx512f(auVar61,ZEXT416((uint)fVar91),
                                                          ZEXT416(0x42000000));
                            fVar93 = pfVar39[-10] + pfVar39[-0xc] + auVar56._0_4_;
                            auVar62 = vaddss_avx512f(ZEXT416((uint)(fVar93 + pfVar39[-0xe])),
                                                     ZEXT416((uint)fVar90));
                            auVar63 = vaddss_avx512f(auVar55,auVar57);
                            auVar64 = vaddss_avx512f(auVar54,auVar56);
                            auVar55 = vfmadd213ss_fma(ZEXT416(0x42000000),ZEXT416((uint)fVar94),
                                                      auVar63);
                            fVar86 = pfVar39[-1];
                            auVar54 = vfmadd213ss_fma(ZEXT416(0x42000000),ZEXT416((uint)fVar8),
                                                      auVar64);
                            fVar88 = *pfVar39;
                            auVar62 = vfmadd231ss_avx512f(auVar62,auVar59,ZEXT416(0x42000000));
                            *puVar27 = auVar61._0_4_;
                            puVar27[(int)uVar50] = auVar62._0_4_;
                            if (iVar12 * 6 + 1 < iVar11) {
                              auVar61 = vfmadd213ss_avx512f(ZEXT416(0x40000000),ZEXT416((uint)fVar8)
                                                            ,auVar64);
                              auVar61 = vfmadd231ss_avx512f(auVar61,auVar60,
                                                            SUB6416(ZEXT464(0x41800000),0));
                              auVar62 = vfmadd213ss_avx512f(ZEXT416(0x40000000),
                                                            ZEXT416((uint)fVar94),auVar63);
                              auVar62 = vfmadd231ss_avx512f(auVar62,ZEXT416((uint)fVar9),
                                                            SUB6416(ZEXT464(0x41800000),0));
                              puVar27[1] = auVar62._0_4_;
                              puVar27[(long)(int)uVar50 + 1] = auVar61._0_4_;
                            }
                            if (iVar12 * 6 + 2 < iVar11) {
                              auVar61 = vfmadd213ss_avx512f(ZEXT416(0x40800000),
                                                            ZEXT416((uint)fVar89),
                                                            ZEXT416((uint)fVar92));
                              auVar61 = vfmadd231ss_avx512f(auVar61,ZEXT416((uint)fVar91),
                                                            ZEXT416(0x41000000));
                              auVar62 = vfmadd213ss_avx512f(ZEXT416(0x40800000),
                                                            ZEXT416((uint)fVar90),
                                                            ZEXT416((uint)fVar93));
                              auVar62 = vfmadd231ss_avx512f(auVar62,auVar59,ZEXT416(0x41000000));
                              puVar27[2] = auVar61._0_4_;
                              puVar27[(long)(int)uVar50 + 2] = auVar62._0_4_;
                            }
                            if (iVar12 * 6 + 3 < iVar11) {
                              auVar61 = vfmadd213ss_avx512f(ZEXT416((uint)fVar94),
                                                            ZEXT416(0x41000000),auVar63);
                              auVar61 = vfmadd213ss_avx512f(ZEXT416((uint)fVar9),ZEXT416(0x40800000)
                                                            ,auVar61);
                              auVar62 = vfmadd213ss_avx512f(ZEXT416((uint)fVar8),ZEXT416(0x41000000)
                                                            ,auVar64);
                              auVar62 = vfmadd213ss_avx512f(auVar60,ZEXT416(0x40800000),auVar62);
                              puVar27[3] = auVar61._0_4_;
                              puVar27[(long)(int)uVar50 + 3] = auVar62._0_4_;
                            }
                            if (iVar12 * 6 + 4 < iVar11) {
                              auVar61 = vfmadd213ss_avx512f(ZEXT416((uint)fVar89),
                                                            SUB6416(ZEXT464(0x41800000),0),
                                                            ZEXT416((uint)fVar92));
                              auVar61 = vfmadd213ss_avx512f(ZEXT416((uint)fVar91),
                                                            ZEXT416(0x40000000),auVar61);
                              auVar62 = vfmadd213ss_avx512f(ZEXT416((uint)fVar90),
                                                            SUB6416(ZEXT464(0x41800000),0),
                                                            ZEXT416((uint)fVar93));
                              auVar59 = vfmadd213ss_avx512f(auVar59,ZEXT416(0x40000000),auVar62);
                              puVar27[4] = auVar61._0_4_;
                              puVar27[(long)(int)uVar50 + 4] = auVar59._0_4_;
                            }
                            auVar127 = ZEXT1664(CONCAT412(0x41800000,
                                                          CONCAT48(0x41800000,0x4180000041800000)));
                            auVar128 = ZEXT1664(CONCAT412(0x40800000,
                                                          CONCAT48(0x40800000,0x4080000040800000)));
                            auVar129 = ZEXT1664(CONCAT412(0x41000000,
                                                          CONCAT48(0x41000000,0x4100000041000000)));
                            if (iVar12 * 6 + 5 < iVar11) {
                              puVar27[5] = fVar9 + auVar55._0_4_ + fVar86;
                              puVar27[(long)(int)uVar50 + 5] =
                                   auVar54._0_4_ + auVar60._0_4_ + fVar88;
                            }
                            puVar27 = puVar27 + iVar11;
                          }
                          lVar15 = lVar15 + 1;
                          pfVar39 = pfVar39 + 0x10;
                        } while (lVar15 != 6);
                        uVar32 = uVar32 + 1;
                        puVar37 = puVar37 + 1;
                      } while (uVar32 != (local_f30 & 0xffffffff));
                    }
                    lVar14 = lVar13 + 2;
                    lVar15 = lVar13 + 3;
                    iVar41 = iVar41 + iVar47 * 0x80;
                    auVar72 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                    lVar13 = lVar14;
                  } while (lVar15 < local_e08);
                  uVar42 = (uint)lVar14;
                }
                if ((int)uVar42 < (int)uVar49) {
                  iVar33 = local_e88->w;
                  pvVar26 = local_e88->data;
                  sVar7 = local_e88->elemsize;
                  local_f20 = local_e88->cstep * sVar7;
                  lVar13 = (long)(int)uVar42;
                  iVar41 = uVar42 * iVar47 * 0x40;
                  local_f28 = (void *)((long)local_f18 + local_ee8 * 4);
                  do {
                    if (local_f18 == (void *)0x0) {
                      fVar86 = 0.0;
                    }
                    else {
                      fVar86 = *(float *)((long)local_f28 + lVar13 * 4);
                    }
                    if (0 < iVar47) {
                      pfVar39 = (float *)((long)local_e00.data + (long)iVar41 * 4);
                      uVar32 = 0;
                      do {
                        iVar34 = iVar28 + (int)uVar32;
                        lVar14 = -0x20;
                        pfVar40 = pfVar39;
                        do {
                          fVar88 = pfVar40[iVar47 * 2] + pfVar40[iVar47];
                          fVar91 = pfVar40[iVar47] - pfVar40[iVar47 * 2];
                          fVar89 = pfVar40[iVar47 * 4] + pfVar40[iVar47 * 3];
                          fVar92 = pfVar40[iVar47 * 3] - pfVar40[iVar47 * 4];
                          fVar90 = pfVar40[iVar47 * 6] + pfVar40[iVar47 * 5];
                          fVar93 = pfVar40[iVar47 * 5] - pfVar40[iVar47 * 6];
                          auVar56 = SUB6416(ZEXT464(0x42000000),0);
                          auVar53 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar89 + fVar88 + *pfVar40)),
                                                        ZEXT416((uint)fVar90),auVar56);
                          *(int *)((long)&pAStack_c60 + lVar14) = auVar53._0_4_;
                          auVar57 = SUB6416(ZEXT464(0x40000000),0);
                          auVar53 = vfmadd213ss_fma(auVar57,ZEXT416((uint)fVar92),
                                                    ZEXT416((uint)fVar91));
                          auVar54 = SUB6416(ZEXT464(0x41800000),0);
                          auVar53 = vfmadd231ss_avx512f(auVar53,ZEXT416((uint)fVar93),auVar54);
                          *(int *)((long)local_c40 + lVar14) = auVar53._0_4_;
                          auVar55 = SUB6416(ZEXT464(0x40800000),0);
                          auVar53 = vfmadd213ss_fma(auVar55,ZEXT416((uint)fVar89),
                                                    ZEXT416((uint)fVar88));
                          auVar58 = SUB6416(ZEXT464(0x41000000),0);
                          auVar53 = vfmadd231ss_avx512f(auVar53,ZEXT416((uint)fVar90),auVar58);
                          *(int *)((long)afStack_c20 + lVar14) = auVar53._0_4_;
                          auVar53 = vfmadd213ss_fma(auVar58,ZEXT416((uint)fVar92),
                                                    ZEXT416((uint)fVar91));
                          auVar53 = vfmadd231ss_avx512f(auVar53,ZEXT416((uint)fVar93),auVar55);
                          *(int *)((long)local_c00 + lVar14) = auVar53._0_4_;
                          auVar53 = vfmadd213ss_avx512f(ZEXT416((uint)fVar89),auVar54,
                                                        ZEXT416((uint)fVar88));
                          auVar53 = vfmadd231ss_avx512f(auVar53,auVar57,ZEXT416((uint)fVar90));
                          *(int *)((long)afStack_be0 + lVar14) = auVar53._0_4_;
                          auVar53 = vfmadd213ss_avx512f(ZEXT416((uint)fVar92),auVar56,
                                                        ZEXT416((uint)fVar91));
                          *(float *)((long)local_bc0 + lVar14) =
                               auVar53._0_4_ + fVar93 + pfVar40[iVar47 * 7];
                          pfVar40 = pfVar40 + iVar47 * 8;
                          lVar14 = lVar14 + 4;
                        } while (lVar14 != 0);
                        iVar12 = iVar34 % (int)uVar46;
                        lVar14 = (long)((iVar34 / (int)uVar46) * 6);
                        puVar27 = (undefined4 *)
                                  ((long)pvVar26 +
                                  (long)(iVar12 * 6) * 4 +
                                  (long)iVar33 * sVar7 * lVar14 + (local_ee8 + lVar13) * local_f20);
                        pfVar40 = afStack_c6c + 2;
                        lVar15 = 0;
                        do {
                          if (lVar15 < local_e40 - lVar14) {
                            fVar89 = pfVar40[-3] + pfVar40[-4];
                            fVar93 = pfVar40[-4] - pfVar40[-3];
                            fVar90 = pfVar40[-1] + pfVar40[-2];
                            fVar94 = pfVar40[-2] - pfVar40[-1];
                            fVar91 = pfVar40[-6] + fVar86 + pfVar40[-5];
                            auVar59 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar91 + pfVar40[-7] +
                                                                        fVar89)),
                                                          ZEXT416((uint)fVar90),auVar56);
                            fVar92 = (pfVar40[-6] - pfVar40[-5]) + fVar86;
                            auVar53 = vfmadd231ss_avx512f(ZEXT416((uint)fVar91),
                                                          ZEXT416((uint)fVar89),auVar54);
                            auVar60 = vfmadd231ss_avx512f(auVar53,ZEXT416((uint)fVar90),auVar57);
                            auVar53 = vfmadd213ss_fma(auVar56,ZEXT416((uint)fVar93),
                                                      ZEXT416((uint)fVar92));
                            fVar88 = *pfVar40;
                            *puVar27 = auVar59._0_4_;
                            if (iVar12 * 6 + 1 < iVar11) {
                              auVar59 = vfmadd231ss_avx512f(ZEXT416((uint)fVar92),
                                                            ZEXT416((uint)fVar93),auVar57);
                              auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)fVar94),auVar54);
                              puVar27[1] = auVar59._0_4_;
                            }
                            if (iVar12 * 6 + 2 < iVar11) {
                              auVar59 = vfmadd213ss_avx512f(ZEXT416((uint)fVar89),auVar55,
                                                            ZEXT416((uint)fVar91));
                              auVar59 = vfmadd213ss_avx512f(ZEXT416((uint)fVar90),auVar58,auVar59);
                              puVar27[2] = auVar59._0_4_;
                            }
                            if (iVar12 * 6 + 3 < iVar11) {
                              auVar59 = vfmadd213ss_avx512f(ZEXT416((uint)fVar93),auVar58,
                                                            ZEXT416((uint)fVar92));
                              auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)fVar94),auVar55);
                              puVar27[3] = auVar59._0_4_;
                            }
                            if (iVar12 * 6 + 4 < iVar11) {
                              puVar27[4] = auVar60._0_4_;
                            }
                            if (iVar12 * 6 + 5 < iVar11) {
                              puVar27[5] = auVar53._0_4_ + fVar88 + fVar94;
                            }
                            puVar27 = puVar27 + iVar11;
                          }
                          lVar15 = lVar15 + 1;
                          pfVar40 = pfVar40 + 8;
                        } while (lVar15 != 6);
                        uVar32 = uVar32 + 1;
                        pfVar39 = pfVar39 + 1;
                      } while (uVar32 != (local_f30 & 0xffffffff));
                    }
                    lVar13 = lVar13 + 1;
                    iVar41 = iVar41 + local_ed8;
                  } while (lVar13 != local_e08);
                }
                uVar32 = (ulong)(iVar28 + local_f34);
              } while ((int)(iVar28 + local_f34) < (int)local_e20);
            }
            piVar10 = (int *)CONCAT44(local_e00.refcount._4_4_,(int)local_e00.refcount);
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + -1;
              UNLOCK();
              if (*piVar10 == 0) {
                if (local_e00.allocator == (Allocator *)0x0) {
                  if ((_func_int ***)local_e00.data != (_func_int ***)0x0) {
                    free(local_e00.data);
                  }
                }
                else {
                  (*(local_e00.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_e00.cstep = 0;
            local_e00.data = (void *)0x0;
            local_e00.refcount._0_4_ = 0;
            local_e00.refcount._4_4_ = 0;
            local_e00.elemsize._0_4_ = 0;
            local_e00.elempack = 0;
            local_e00.c = 0;
            local_edc = local_edc + 1;
            local_e00.elemsize._4_4_ = (int)local_e00.refcount;
            local_e00.dims = local_e00.refcount._4_4_;
            local_e00.w = (int)local_e00.elemsize;
            local_e00.h = (int)local_e00.refcount;
            local_e00.d = local_e00.elempack;
          } while (local_edc != local_e24);
        }
        iVar28 = 0;
      }
      piVar10 = (int *)CONCAT44(local_ed0.refcount._4_4_,(int)local_ed0.refcount);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_ed0.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_ed0.data != (Allocator *)0x0) {
              free(local_ed0.data);
            }
          }
          else {
            (*(local_ed0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_ed0.cstep = 0;
      local_ed0.data = (void *)0x0;
      local_ed0.refcount._0_4_ = 0;
      local_ed0.refcount._4_4_ = 0;
      local_ed0.elemsize._0_4_ = 0;
      local_ed0.elemsize._4_4_ = 0;
      local_ed0.elempack = 0;
      local_ed0.dims = 0;
      local_ed0.w = 0;
      local_ed0.h = 0;
      local_ed0.d = 0;
      local_ed0.c = 0;
      goto LAB_001b3436;
    }
    piVar10 = (int *)CONCAT44(fStack_c74,fStack_c78);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (pAStack_c60 == (Allocator *)0x0) {
LAB_001b0489:
          if (local_c80 != (undefined1  [8])0x0) {
            free((void *)local_c80);
          }
        }
        else {
          (*pAStack_c60->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_c40[0] = 0;
  local_c80 = (undefined1  [8])0x0;
  fStack_c78 = 0.0;
  fStack_c74 = 0.0;
  fStack_c70 = 0.0;
  afStack_c6c[0] = 0.0;
  afStack_c6c[1] = 0.0;
  iStack_c58 = 0;
  iStack_c54 = 0;
  iStack_c50 = 0;
  fStack_c4c = 0.0;
  iStack_c48 = 0;
LAB_001b3436:
  piVar10 = (int *)CONCAT44(local_db0.refcount._4_4_,local_db0.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_db0.allocator == (Allocator *)0x0) {
        if (local_db0.data != (void *)0x0) {
          free(local_db0.data);
        }
      }
      else {
        (*(local_db0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

static int conv3x3s1_winograd63(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 6n+2, winograd F(6,3)
    int w_tiles = (outw + 5) / 6;
    int h_tiles = (outh + 5) / 6;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 64;

    // NCNN_LOGE("conv3x3s1_winograd63 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd63_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd63_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd63_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }

    return 0;
}